

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  int iVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  uint uVar92;
  undefined1 (*pauVar93) [32];
  uint uVar94;
  uint uVar95;
  ulong uVar96;
  int iVar97;
  ulong uVar98;
  ulong uVar99;
  bool bVar100;
  bool bVar101;
  byte bVar102;
  float fVar103;
  float fVar105;
  float fVar138;
  vint4 bi_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined4 uVar104;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar110 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar146 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar170 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar178 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  vint4 ai_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar195 [16];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar215;
  vint4 ai;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar216;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar217;
  float fVar226;
  float fVar227;
  vint4 bi;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar233 [16];
  float fVar236;
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar237;
  float fVar247;
  float fVar248;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar249;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar250;
  float fVar251;
  undefined1 auVar246 [64];
  float fVar252;
  float fVar265;
  float fVar266;
  vint4 ai_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar267;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar285;
  undefined1 auVar284 [64];
  float s;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar289 [64];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  float fVar297;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar298 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c08;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  uint uStack_b44;
  float local_b20;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined4 local_aa0;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  uint local_800;
  uint uStack_7fc;
  uint uStack_7f8;
  uint uStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint uStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar279 [64];
  undefined1 auVar280 [16];
  
  PVar2 = prim[1];
  uVar96 = (ulong)(byte)PVar2;
  fVar103 = *(float *)(prim + uVar96 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar96 * 0x19 + 6));
  auVar106._0_4_ = fVar103 * auVar5._0_4_;
  auVar106._4_4_ = fVar103 * auVar5._4_4_;
  auVar106._8_4_ = fVar103 * auVar5._8_4_;
  auVar106._12_4_ = fVar103 * auVar5._12_4_;
  auVar218._0_4_ = fVar103 * auVar6._0_4_;
  auVar218._4_4_ = fVar103 * auVar6._4_4_;
  auVar218._8_4_ = fVar103 * auVar6._8_4_;
  auVar218._12_4_ = fVar103 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 6 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar96 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar98 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + uVar96 + 6)));
  auVar108 = vcvtdq2ps_avx(auVar108);
  uVar98 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar162 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar98 + 6)));
  auVar162 = vcvtdq2ps_avx(auVar162);
  auVar294._4_4_ = auVar218._0_4_;
  auVar294._0_4_ = auVar218._0_4_;
  auVar294._8_4_ = auVar218._0_4_;
  auVar294._12_4_ = auVar218._0_4_;
  auVar140 = vshufps_avx(auVar218,auVar218,0x55);
  auVar107 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar103 = auVar107._0_4_;
  auVar276._0_4_ = fVar103 * auVar8._0_4_;
  fVar138 = auVar107._4_4_;
  auVar276._4_4_ = fVar138 * auVar8._4_4_;
  fVar202 = auVar107._8_4_;
  auVar276._8_4_ = fVar202 * auVar8._8_4_;
  fVar105 = auVar107._12_4_;
  auVar276._12_4_ = fVar105 * auVar8._12_4_;
  auVar272._0_4_ = auVar11._0_4_ * fVar103;
  auVar272._4_4_ = auVar11._4_4_ * fVar138;
  auVar272._8_4_ = auVar11._8_4_ * fVar202;
  auVar272._12_4_ = auVar11._12_4_ * fVar105;
  auVar253._0_4_ = auVar162._0_4_ * fVar103;
  auVar253._4_4_ = auVar162._4_4_ * fVar138;
  auVar253._8_4_ = auVar162._8_4_ * fVar202;
  auVar253._12_4_ = auVar162._12_4_ * fVar105;
  auVar107 = vfmadd231ps_fma(auVar276,auVar140,auVar6);
  auVar141 = vfmadd231ps_fma(auVar272,auVar140,auVar10);
  auVar140 = vfmadd231ps_fma(auVar253,auVar108,auVar140);
  auVar116 = vfmadd231ps_fma(auVar107,auVar294,auVar5);
  auVar141 = vfmadd231ps_fma(auVar141,auVar294,auVar9);
  auVar204 = vfmadd231ps_fma(auVar140,auVar109,auVar294);
  auVar295._4_4_ = auVar106._0_4_;
  auVar295._0_4_ = auVar106._0_4_;
  auVar295._8_4_ = auVar106._0_4_;
  auVar295._12_4_ = auVar106._0_4_;
  auVar140 = vshufps_avx(auVar106,auVar106,0x55);
  auVar107 = vshufps_avx(auVar106,auVar106,0xaa);
  fVar103 = auVar107._0_4_;
  auVar219._0_4_ = fVar103 * auVar8._0_4_;
  fVar138 = auVar107._4_4_;
  auVar219._4_4_ = fVar138 * auVar8._4_4_;
  fVar202 = auVar107._8_4_;
  auVar219._8_4_ = fVar202 * auVar8._8_4_;
  fVar105 = auVar107._12_4_;
  auVar219._12_4_ = fVar105 * auVar8._12_4_;
  auVar139._0_4_ = auVar11._0_4_ * fVar103;
  auVar139._4_4_ = auVar11._4_4_ * fVar138;
  auVar139._8_4_ = auVar11._8_4_ * fVar202;
  auVar139._12_4_ = auVar11._12_4_ * fVar105;
  auVar107._0_4_ = auVar162._0_4_ * fVar103;
  auVar107._4_4_ = auVar162._4_4_ * fVar138;
  auVar107._8_4_ = auVar162._8_4_ * fVar202;
  auVar107._12_4_ = auVar162._12_4_ * fVar105;
  auVar6 = vfmadd231ps_fma(auVar219,auVar140,auVar6);
  auVar8 = vfmadd231ps_fma(auVar139,auVar140,auVar10);
  auVar10 = vfmadd231ps_fma(auVar107,auVar140,auVar108);
  auVar11 = vfmadd231ps_fma(auVar6,auVar295,auVar5);
  auVar108 = vfmadd231ps_fma(auVar8,auVar295,auVar9);
  auVar162 = vfmadd231ps_fma(auVar10,auVar295,auVar109);
  auVar238._8_4_ = 0x7fffffff;
  auVar238._0_8_ = 0x7fffffff7fffffff;
  auVar238._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar116,auVar238);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar203,1);
  auVar6 = vblendvps_avx(auVar116,auVar203,auVar5);
  auVar5 = vandps_avx(auVar141,auVar238);
  auVar5 = vcmpps_avx(auVar5,auVar203,1);
  auVar8 = vblendvps_avx(auVar141,auVar203,auVar5);
  auVar5 = vandps_avx(auVar204,auVar238);
  auVar5 = vcmpps_avx(auVar5,auVar203,1);
  auVar5 = vblendvps_avx(auVar204,auVar203,auVar5);
  auVar9 = vrcpps_avx(auVar6);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar9,auVar239);
  auVar9 = vfmadd132ps_fma(auVar6,auVar9,auVar9);
  auVar6 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar6,auVar239);
  auVar10 = vfmadd132ps_fma(auVar8,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar239);
  auVar109 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar96 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar204._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar204._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar204._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar204._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar96 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar11);
  auVar220._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar220._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar220._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar220._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar141._1_3_ = 0;
  auVar141[0] = PVar2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar96 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar108);
  auVar254._0_4_ = auVar5._0_4_ * auVar10._0_4_;
  auVar254._4_4_ = auVar5._4_4_ * auVar10._4_4_;
  auVar254._8_4_ = auVar5._8_4_ * auVar10._8_4_;
  auVar254._12_4_ = auVar5._12_4_ * auVar10._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar108);
  auVar140._0_4_ = auVar10._0_4_ * auVar5._0_4_;
  auVar140._4_4_ = auVar10._4_4_ * auVar5._4_4_;
  auVar140._8_4_ = auVar10._8_4_ * auVar5._8_4_;
  auVar140._12_4_ = auVar10._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar98 + uVar96 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar162);
  auVar116._0_4_ = auVar109._0_4_ * auVar5._0_4_;
  auVar116._4_4_ = auVar109._4_4_ * auVar5._4_4_;
  auVar116._8_4_ = auVar109._8_4_ * auVar5._8_4_;
  auVar116._12_4_ = auVar109._12_4_ * auVar5._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar96 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar11);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar162);
  auVar108._0_4_ = auVar109._0_4_ * auVar5._0_4_;
  auVar108._4_4_ = auVar109._4_4_ * auVar5._4_4_;
  auVar108._8_4_ = auVar109._8_4_ * auVar5._8_4_;
  auVar108._12_4_ = auVar109._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar204,auVar220);
  auVar6 = vpminsd_avx(auVar254,auVar140);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar116,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar268._4_4_ = uVar104;
  auVar268._0_4_ = uVar104;
  auVar268._8_4_ = uVar104;
  auVar268._12_4_ = uVar104;
  auVar6 = vmaxps_avx(auVar6,auVar268);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_580._0_4_ = auVar5._0_4_ * 0.99999964;
  local_580._4_4_ = auVar5._4_4_ * 0.99999964;
  local_580._8_4_ = auVar5._8_4_ * 0.99999964;
  local_580._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar204,auVar220);
  auVar6 = vpmaxsd_avx(auVar254,auVar140);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar116,auVar108);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar162._4_4_ = uVar104;
  auVar162._0_4_ = uVar104;
  auVar162._8_4_ = uVar104;
  auVar162._12_4_ = uVar104;
  auVar6 = vminps_avx(auVar6,auVar162);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar109._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar141[4] = PVar2;
  auVar141._5_3_ = 0;
  auVar141[8] = PVar2;
  auVar141._9_3_ = 0;
  auVar141[0xc] = PVar2;
  auVar141._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar141,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_580,auVar109,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar92 = vmovmskps_avx(auVar5);
  if (uVar92 == 0) {
    return false;
  }
  uVar92 = uVar92 & 0xff;
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  local_540 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  auVar289 = ZEXT3264(local_540);
  local_820 = 0x7fffffff;
  uStack_81c = 0x7fffffff;
  uStack_818 = 0x7fffffff;
  uStack_814 = 0x7fffffff;
  uStack_810 = 0x7fffffff;
  uStack_80c = 0x7fffffff;
  uStack_808 = 0x7fffffff;
  uStack_804 = 0x7fffffff;
  local_800 = 0x80000000;
  uStack_7fc = 0x80000000;
  uStack_7f8 = 0x80000000;
  uStack_7f4 = 0x80000000;
  fStack_7f0 = -0.0;
  fStack_7ec = -0.0;
  fStack_7e8 = -0.0;
  uStack_7e4 = 0x80000000;
  local_890 = prim;
LAB_0160a9bf:
  lVar25 = 0;
  local_888 = (ulong)uVar92;
  for (uVar98 = local_888; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar92 = *(uint *)(local_890 + 2);
  local_760 = *(uint *)(local_890 + lVar25 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar92].ptr;
  uVar98 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_760);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar25 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar25 + (long)p_Var4 * uVar98);
  auVar6 = *(undefined1 (*) [16])(lVar25 + (uVar98 + 1) * (long)p_Var4);
  local_888 = local_888 - 1 & local_888;
  if (local_888 != 0) {
    uVar99 = local_888 - 1 & local_888;
    for (uVar96 = local_888; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
    }
    if (uVar99 != 0) {
      for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar273._4_4_ = uVar104;
  auVar273._0_4_ = uVar104;
  auVar273._8_4_ = uVar104;
  auVar273._12_4_ = uVar104;
  fStack_7d0 = (float)uVar104;
  _local_7e0 = auVar273;
  fStack_7cc = (float)uVar104;
  fStack_7c8 = (float)uVar104;
  register0x0000149c = uVar104;
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar277._4_4_ = uVar104;
  auVar277._0_4_ = uVar104;
  auVar277._8_4_ = uVar104;
  auVar277._12_4_ = uVar104;
  fStack_a10 = (float)uVar104;
  _local_a20 = auVar277;
  fStack_a0c = (float)uVar104;
  fStack_a08 = (float)uVar104;
  register0x000014dc = uVar104;
  auVar279 = ZEXT3264(_local_a20);
  auVar8 = vunpcklps_avx(auVar273,auVar277);
  fVar103 = *(float *)(ray + k * 4 + 0x60);
  auVar280._4_4_ = fVar103;
  auVar280._0_4_ = fVar103;
  auVar280._8_4_ = fVar103;
  auVar280._12_4_ = fVar103;
  fStack_970 = fVar103;
  _local_980 = auVar280;
  fStack_96c = fVar103;
  fStack_968 = fVar103;
  register0x0000151c = fVar103;
  auVar284 = ZEXT3264(_local_980);
  local_990 = vinsertps_avx(auVar8,auVar280,0x28);
  auVar264 = ZEXT1664(local_990);
  auVar221._0_4_ = (auVar5._0_4_ + auVar6._0_4_) * 0.5;
  auVar221._4_4_ = (auVar5._4_4_ + auVar6._4_4_) * 0.5;
  auVar221._8_4_ = (auVar5._8_4_ + auVar6._8_4_) * 0.5;
  auVar221._12_4_ = (auVar5._12_4_ + auVar6._12_4_) * 0.5;
  auVar8 = vsubps_avx(auVar221,auVar9);
  auVar8 = vdpps_avx(auVar8,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  auVar271 = ZEXT1664(local_9a0);
  auVar10 = vrcpss_avx(local_9a0,local_9a0);
  auVar11 = vfnmadd213ss_fma(auVar10,local_9a0,ZEXT416(0x40000000));
  local_2a0 = auVar8._0_4_ * auVar10._0_4_ * auVar11._0_4_;
  auVar233._4_4_ = local_2a0;
  auVar233._0_4_ = local_2a0;
  auVar233._8_4_ = local_2a0;
  auVar233._12_4_ = local_2a0;
  fStack_9f0 = local_2a0;
  _local_a00 = auVar233;
  fStack_9ec = local_2a0;
  fStack_9e8 = local_2a0;
  fStack_9e4 = local_2a0;
  auVar8 = vfmadd231ps_fma(auVar9,local_990,auVar233);
  auVar8 = vblendps_avx(auVar8,_DAT_01f7aa10,8);
  auVar9 = vsubps_avx(auVar5,auVar8);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + (uVar98 + 2) * (long)p_Var4),auVar8);
  auVar11 = vsubps_avx(auVar6,auVar8);
  auVar8 = vsubps_avx(*(undefined1 (*) [16])(lVar25 + (uVar98 + 3) * (long)p_Var4),auVar8);
  auVar5 = vmovshdup_avx(auVar9);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_3a0 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar11);
  local_3c0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar11,auVar11,0xaa);
  local_3e0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar11,auVar11,0xff);
  local_400 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar10);
  local_420 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_440 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_460 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar8);
  local_480 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_4a0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_4c0 = auVar5._0_8_;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar103 * fVar103)),_local_a20,_local_a20);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_7e0,_local_7e0);
  uVar104 = auVar5._0_4_;
  local_220._4_4_ = uVar104;
  local_220._0_4_ = uVar104;
  local_220._8_4_ = uVar104;
  local_220._12_4_ = uVar104;
  local_220._16_4_ = uVar104;
  local_220._20_4_ = uVar104;
  local_220._24_4_ = uVar104;
  local_220._28_4_ = uVar104;
  auVar246 = ZEXT3264(local_220);
  fVar103 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)local_2a0);
  local_2a0 = fVar103 - local_2a0;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_c08 = 1;
  uVar98 = 0;
  bVar100 = false;
  local_4e0 = auVar9._0_4_;
  local_500 = auVar11._0_4_;
  local_520 = auVar10._0_4_;
  fVar138 = auVar8._0_4_;
  auVar224._4_4_ = uStack_81c;
  auVar224._0_4_ = local_820;
  auVar224._8_4_ = uStack_818;
  auVar224._12_4_ = uStack_814;
  auVar224._16_4_ = uStack_810;
  auVar224._20_4_ = uStack_80c;
  auVar224._24_4_ = uStack_808;
  auVar224._28_4_ = uStack_804;
  local_560 = vandps_avx(local_220,auVar224);
  auVar5 = vsqrtss_avx(local_9a0,local_9a0);
  auVar6 = vsqrtss_avx(local_9a0,local_9a0);
  auVar235 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_280 = fVar138;
  fStack_27c = fVar138;
  fStack_278 = fVar138;
  fStack_274 = fVar138;
  fStack_270 = fVar138;
  fStack_26c = fVar138;
  fStack_268 = fVar138;
  fStack_264 = fVar138;
  uStack_75c = local_760;
  uStack_758 = local_760;
  uStack_754 = local_760;
  local_750 = uVar92;
  uStack_74c = uVar92;
  uStack_748 = uVar92;
  uStack_744 = uVar92;
  uStack_51c = local_520;
  uStack_518 = local_520;
  uStack_514 = local_520;
  uStack_510 = local_520;
  uStack_50c = local_520;
  uStack_508 = local_520;
  uStack_504 = local_520;
  uStack_4fc = local_500;
  uStack_4f8 = local_500;
  uStack_4f4 = local_500;
  uStack_4f0 = local_500;
  uStack_4ec = local_500;
  uStack_4e8 = local_500;
  uStack_4e4 = local_500;
  uStack_4dc = local_4e0;
  uStack_4d8 = local_4e0;
  uStack_4d4 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4cc = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4c4 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  uStack_418 = local_420;
  uStack_410 = local_420;
  uStack_408 = local_420;
  uStack_3f8 = local_400;
  uStack_3f0 = local_400;
  uStack_3e8 = local_400;
  uStack_3d8 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3b8 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  do {
    auVar211._8_4_ = 0x3f800000;
    auVar211._0_8_ = 0x3f8000003f800000;
    auVar211._12_4_ = 0x3f800000;
    auVar211._16_4_ = 0x3f800000;
    auVar211._20_4_ = 0x3f800000;
    auVar211._24_4_ = 0x3f800000;
    auVar211._28_4_ = 0x3f800000;
    iVar97 = (int)uVar98;
    local_570 = auVar235._0_16_;
    auVar109 = vmovshdup_avx(local_570);
    auVar109 = vsubps_avx(auVar109,local_570);
    local_9e0._0_4_ = auVar109._0_4_;
    fVar202 = (float)local_9e0._0_4_ * 0.04761905;
    local_9c0._0_4_ = auVar235._0_4_;
    local_9c0._4_4_ = local_9c0._0_4_;
    local_9c0._8_4_ = local_9c0._0_4_;
    local_9c0._12_4_ = local_9c0._0_4_;
    local_9c0._16_4_ = local_9c0._0_4_;
    local_9c0._20_4_ = local_9c0._0_4_;
    local_9c0._24_4_ = local_9c0._0_4_;
    local_9c0._28_4_ = local_9c0._0_4_;
    local_9e0._4_4_ = local_9e0._0_4_;
    local_9e0._8_4_ = local_9e0._0_4_;
    local_9e0._12_4_ = local_9e0._0_4_;
    local_9e0._16_4_ = local_9e0._0_4_;
    local_9e0._20_4_ = local_9e0._0_4_;
    local_9e0._24_4_ = local_9e0._0_4_;
    local_9e0._28_4_ = local_9e0._0_4_;
    auVar109 = vfmadd231ps_fma(local_9c0,local_9e0,_DAT_01faff20);
    auVar121 = vsubps_avx(auVar211,ZEXT1632(auVar109));
    fVar285 = auVar109._0_4_;
    fVar216 = auVar109._4_4_;
    fVar232 = auVar109._8_4_;
    fVar236 = auVar109._12_4_;
    fVar105 = auVar121._0_4_;
    fVar237 = auVar121._4_4_;
    fVar247 = auVar121._8_4_;
    fVar248 = auVar121._12_4_;
    fVar249 = auVar121._16_4_;
    fVar250 = auVar121._20_4_;
    fVar251 = auVar121._24_4_;
    auVar235._28_36_ = auVar246._28_36_;
    auVar235._0_28_ =
         ZEXT1628(CONCAT412(fVar236 * fVar236,
                            CONCAT48(fVar232 * fVar232,CONCAT44(fVar216 * fVar216,fVar285 * fVar285)
                                    )));
    fVar252 = fVar285 * 3.0;
    fVar265 = fVar216 * 3.0;
    fVar266 = fVar232 * 3.0;
    fVar267 = fVar236 * 3.0;
    auVar246._0_4_ = fVar105 * fVar105;
    auVar246._4_4_ = fVar237 * fVar237;
    auVar246._8_4_ = fVar247 * fVar247;
    auVar246._12_4_ = fVar248 * fVar248;
    auVar246._16_4_ = fVar249 * fVar249;
    auVar246._20_4_ = fVar250 * fVar250;
    auVar246._28_36_ = auVar279._28_36_;
    auVar246._24_4_ = fVar251 * fVar251;
    fVar215 = auVar121._28_4_;
    auVar279._0_4_ = (auVar246._0_4_ * (fVar105 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._4_4_ = (auVar246._4_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._8_4_ = (auVar246._8_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._12_4_ = (auVar246._12_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._16_4_ = (auVar246._16_4_ * (fVar249 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._20_4_ = (auVar246._20_4_ * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar279._28_36_ = auVar289._28_36_;
    auVar279._24_4_ = (auVar246._24_4_ * (fVar251 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar121 = auVar279._0_32_;
    fVar217 = fVar285 * fVar285 * (float)((uint)fVar105 ^ local_800) * 0.5;
    fVar226 = fVar216 * fVar216 * (float)((uint)fVar237 ^ uStack_7fc) * 0.5;
    fVar227 = fVar232 * fVar232 * (float)((uint)fVar247 ^ uStack_7f8) * 0.5;
    fVar228 = fVar236 * fVar236 * (float)((uint)fVar248 ^ uStack_7f4) * 0.5;
    fVar229 = (float)((uint)fVar249 ^ (uint)fStack_7f0) * 0.0 * 0.0 * 0.5;
    fVar230 = (float)((uint)fVar250 ^ (uint)fStack_7ec) * 0.0 * 0.0 * 0.5;
    fVar231 = (float)((uint)fVar251 ^ (uint)fStack_7e8) * 0.0 * 0.0 * 0.5;
    auVar15._4_4_ = fStack_27c * fVar226;
    auVar15._0_4_ = local_280 * fVar217;
    auVar15._8_4_ = fStack_278 * fVar227;
    auVar15._12_4_ = fStack_274 * fVar228;
    auVar15._16_4_ = fStack_270 * fVar229;
    auVar15._20_4_ = fStack_26c * fVar230;
    auVar15._24_4_ = fStack_268 * fVar231;
    auVar15._28_4_ = (uint)fVar215 ^ uStack_7e4;
    auVar13._4_4_ = fVar226 * local_480._4_4_;
    auVar13._0_4_ = fVar217 * (float)local_480;
    auVar13._8_4_ = fVar227 * (float)uStack_478;
    auVar13._12_4_ = fVar228 * uStack_478._4_4_;
    auVar13._16_4_ = fVar229 * (float)uStack_470;
    auVar13._20_4_ = fVar230 * uStack_470._4_4_;
    auVar13._24_4_ = fVar231 * (float)uStack_468;
    auVar13._28_4_ = auVar271._28_4_ + -5.0 + 2.0;
    auVar179._0_4_ = fVar217 * (float)local_4a0;
    auVar179._4_4_ = fVar226 * local_4a0._4_4_;
    auVar179._8_4_ = fVar227 * (float)uStack_498;
    auVar179._12_4_ = fVar228 * uStack_498._4_4_;
    auVar179._16_4_ = fVar229 * (float)uStack_490;
    auVar179._20_4_ = fVar230 * uStack_490._4_4_;
    auVar179._24_4_ = fVar231 * (float)uStack_488;
    auVar179._28_4_ = 0;
    auVar16._4_4_ = fVar226 * local_4c0._4_4_;
    auVar16._0_4_ = fVar217 * (float)local_4c0;
    auVar16._8_4_ = fVar227 * (float)uStack_4b8;
    auVar16._12_4_ = fVar228 * uStack_4b8._4_4_;
    auVar16._16_4_ = fVar229 * (float)uStack_4b0;
    auVar16._20_4_ = fVar230 * uStack_4b0._4_4_;
    auVar16._24_4_ = fVar231 * (float)uStack_4a8;
    auVar16._28_4_ = uStack_7e4;
    auVar122._4_4_ = uStack_51c;
    auVar122._0_4_ = local_520;
    auVar122._8_4_ = uStack_518;
    auVar122._12_4_ = uStack_514;
    auVar122._16_4_ = uStack_510;
    auVar122._20_4_ = uStack_50c;
    auVar122._24_4_ = uStack_508;
    auVar122._28_4_ = uStack_504;
    auVar109 = vfmadd231ps_fma(auVar15,auVar121,auVar122);
    auVar76._8_8_ = uStack_418;
    auVar76._0_8_ = local_420;
    auVar76._16_8_ = uStack_410;
    auVar76._24_8_ = uStack_408;
    auVar108 = vfmadd231ps_fma(auVar13,auVar121,auVar76);
    auVar74._8_8_ = uStack_438;
    auVar74._0_8_ = local_440;
    auVar74._16_8_ = uStack_430;
    auVar74._24_8_ = uStack_428;
    auVar162 = vfmadd231ps_fma(auVar179,auVar121,auVar74);
    auVar72._8_8_ = uStack_458;
    auVar72._0_8_ = local_460;
    auVar72._16_8_ = uStack_450;
    auVar72._24_8_ = uStack_448;
    auVar140 = vfmadd231ps_fma(auVar16,auVar121,auVar72);
    auVar17._4_4_ = fVar237 * fVar237 * (float)((uint)fVar216 ^ uStack_7fc) * 0.5;
    auVar17._0_4_ = fVar105 * fVar105 * (float)((uint)fVar285 ^ local_800) * 0.5;
    auVar17._8_4_ = fVar247 * fVar247 * (float)((uint)fVar232 ^ uStack_7f8) * 0.5;
    auVar17._12_4_ = fVar248 * fVar248 * (float)((uint)fVar236 ^ uStack_7f4) * 0.5;
    auVar17._16_4_ = fVar249 * fVar249 * fStack_7f0 * 0.5;
    auVar17._20_4_ = fVar250 * fVar250 * fStack_7ec * 0.5;
    auVar17._24_4_ = fVar251 * fVar251 * fStack_7e8 * 0.5;
    auVar17._28_4_ = auVar284._28_4_;
    auVar130._4_4_ = ((fVar265 + -5.0) * fVar216 * fVar216 + 2.0) * 0.5;
    auVar130._0_4_ = ((fVar252 + -5.0) * fVar285 * fVar285 + 2.0) * 0.5;
    auVar130._8_4_ = ((fVar266 + -5.0) * fVar232 * fVar232 + 2.0) * 0.5;
    auVar130._12_4_ = ((fVar267 + -5.0) * fVar236 * fVar236 + 2.0) * 0.5;
    auVar130._16_4_ = 0x3f800000;
    auVar130._20_4_ = 0x3f800000;
    auVar130._24_4_ = 0x3f800000;
    auVar130._28_4_ = auVar289._28_4_ + 2.0;
    auVar68._4_4_ = uStack_4fc;
    auVar68._0_4_ = local_500;
    auVar68._8_4_ = uStack_4f8;
    auVar68._12_4_ = uStack_4f4;
    auVar68._16_4_ = uStack_4f0;
    auVar68._20_4_ = uStack_4ec;
    auVar68._24_4_ = uStack_4e8;
    auVar68._28_4_ = uStack_4e4;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar130,auVar68);
    auVar82._8_8_ = uStack_3b8;
    auVar82._0_8_ = local_3c0;
    auVar82._16_8_ = uStack_3b0;
    auVar82._24_8_ = uStack_3a8;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar130,auVar82);
    auVar80._8_8_ = uStack_3d8;
    auVar80._0_8_ = local_3e0;
    auVar80._16_8_ = uStack_3d0;
    auVar80._24_8_ = uStack_3c8;
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar130,auVar80);
    auVar78._8_8_ = uStack_3f8;
    auVar78._0_8_ = local_400;
    auVar78._16_8_ = uStack_3f0;
    auVar78._24_8_ = uStack_3e8;
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar130,auVar78);
    auVar70._4_4_ = uStack_4dc;
    auVar70._0_4_ = local_4e0;
    auVar70._8_4_ = uStack_4d8;
    auVar70._12_4_ = uStack_4d4;
    auVar70._16_4_ = uStack_4d0;
    auVar70._20_4_ = uStack_4cc;
    auVar70._24_4_ = uStack_4c8;
    auVar70._28_4_ = uStack_4c4;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar17,auVar70);
    auVar90._8_8_ = uStack_1d8;
    auVar90._0_8_ = local_1e0;
    auVar90._16_8_ = uStack_1d0;
    auVar90._24_8_ = uStack_1c8;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar17,auVar90);
    auVar122 = ZEXT1632(auVar109);
    auVar89._8_8_ = uStack_1f8;
    auVar89._0_8_ = local_200;
    auVar89._16_8_ = uStack_1f0;
    auVar89._24_8_ = uStack_1e8;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar17,auVar89);
    auVar84._8_8_ = uStack_398;
    auVar84._0_8_ = local_3a0;
    auVar84._16_8_ = uStack_390;
    auVar84._24_8_ = uStack_388;
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar17,auVar84);
    auVar155._4_4_ = (fVar237 + fVar237) * fVar216;
    auVar155._0_4_ = (fVar105 + fVar105) * fVar285;
    auVar155._8_4_ = (fVar247 + fVar247) * fVar232;
    auVar155._12_4_ = (fVar248 + fVar248) * fVar236;
    auVar155._16_4_ = (fVar249 + fVar249) * 0.0;
    auVar155._20_4_ = (fVar250 + fVar250) * 0.0;
    auVar155._24_4_ = (fVar251 + fVar251) * 0.0;
    auVar155._28_4_ = 0;
    auVar121 = vsubps_avx(auVar155,auVar246._0_32_);
    fVar217 = auVar264._28_4_ + 2.0;
    auVar18._4_4_ = (fVar237 + fVar237) * (fVar265 + 2.0);
    auVar18._0_4_ = (fVar105 + fVar105) * (fVar252 + 2.0);
    auVar18._8_4_ = (fVar247 + fVar247) * (fVar266 + 2.0);
    auVar18._12_4_ = (fVar248 + fVar248) * (fVar267 + 2.0);
    auVar18._16_4_ = (fVar249 + fVar249) * 2.0;
    auVar18._20_4_ = (fVar250 + fVar250) * 2.0;
    auVar18._24_4_ = (fVar251 + fVar251) * 2.0;
    auVar18._28_4_ = fVar217;
    auVar213._4_4_ = fVar237 * 3.0 * fVar237;
    auVar213._0_4_ = fVar105 * 3.0 * fVar105;
    auVar213._8_4_ = fVar247 * 3.0 * fVar247;
    auVar213._12_4_ = fVar248 * 3.0 * fVar248;
    auVar213._16_4_ = fVar249 * 3.0 * fVar249;
    auVar213._20_4_ = fVar250 * 3.0 * fVar250;
    auVar213._24_4_ = fVar251 * 3.0 * fVar251;
    auVar213._28_4_ = fVar215;
    auVar224 = vsubps_avx(auVar18,auVar213);
    auVar15 = vsubps_avx(auVar235._0_32_,auVar155);
    auVar20._4_4_ = auVar121._4_4_ * 0.5;
    auVar20._0_4_ = auVar121._0_4_ * 0.5;
    auVar20._8_4_ = auVar121._8_4_ * 0.5;
    auVar20._12_4_ = auVar121._12_4_ * 0.5;
    auVar20._16_4_ = auVar121._16_4_ * 0.5;
    auVar20._20_4_ = auVar121._20_4_ * 0.5;
    auVar20._24_4_ = auVar121._24_4_ * 0.5;
    auVar20._28_4_ = fVar217;
    auVar21._28_4_ = auVar264._28_4_ + -5.0 + 0.0;
    auVar21._0_28_ =
         ZEXT1628(CONCAT412(((fVar236 + fVar236) * (fVar267 + -5.0) + fVar267 * fVar236) * 0.5,
                            CONCAT48(((fVar232 + fVar232) * (fVar266 + -5.0) + fVar266 * fVar232) *
                                     0.5,CONCAT44(((fVar216 + fVar216) * (fVar265 + -5.0) +
                                                  fVar265 * fVar216) * 0.5,
                                                  ((fVar285 + fVar285) * (fVar252 + -5.0) +
                                                  fVar252 * fVar285) * 0.5))));
    auVar22._4_4_ = auVar224._4_4_ * 0.5;
    auVar22._0_4_ = auVar224._0_4_ * 0.5;
    auVar22._8_4_ = auVar224._8_4_ * 0.5;
    auVar22._12_4_ = auVar224._12_4_ * 0.5;
    auVar22._16_4_ = auVar224._16_4_ * 0.5;
    auVar22._20_4_ = auVar224._20_4_ * 0.5;
    fVar105 = auVar224._28_4_;
    auVar22._24_4_ = auVar224._24_4_ * 0.5;
    auVar22._28_4_ = fVar105;
    fVar237 = auVar15._0_4_ * 0.5;
    fVar247 = auVar15._4_4_ * 0.5;
    fVar248 = auVar15._8_4_ * 0.5;
    fVar249 = auVar15._12_4_ * 0.5;
    fVar250 = auVar15._16_4_ * 0.5;
    fVar251 = auVar15._20_4_ * 0.5;
    fVar217 = auVar15._24_4_ * 0.5;
    auVar23._4_4_ = fStack_27c * fVar247;
    auVar23._0_4_ = local_280 * fVar237;
    auVar23._8_4_ = fStack_278 * fVar248;
    auVar23._12_4_ = fStack_274 * fVar249;
    auVar23._16_4_ = fStack_270 * fVar250;
    auVar23._20_4_ = fStack_26c * fVar251;
    auVar23._24_4_ = fStack_268 * fVar217;
    auVar23._28_4_ = auVar271._28_4_;
    auVar152._4_4_ = fVar247 * local_480._4_4_;
    auVar152._0_4_ = fVar237 * (float)local_480;
    auVar152._8_4_ = fVar248 * (float)uStack_478;
    auVar152._12_4_ = fVar249 * uStack_478._4_4_;
    auVar152._16_4_ = fVar250 * (float)uStack_470;
    auVar152._20_4_ = fVar251 * uStack_470._4_4_;
    auVar152._24_4_ = fVar217 * (float)uStack_468;
    auVar152._28_4_ = 0x40000000;
    auVar180._4_4_ = fVar247 * local_4a0._4_4_;
    auVar180._0_4_ = fVar237 * (float)local_4a0;
    auVar180._8_4_ = fVar248 * (float)uStack_498;
    auVar180._12_4_ = fVar249 * uStack_498._4_4_;
    auVar180._16_4_ = fVar250 * (float)uStack_490;
    auVar180._20_4_ = fVar251 * uStack_490._4_4_;
    auVar180._24_4_ = fVar217 * (float)uStack_488;
    auVar180._28_4_ = auVar121._28_4_;
    auVar278._4_4_ = fVar247 * local_4c0._4_4_;
    auVar278._0_4_ = fVar237 * (float)local_4c0;
    auVar278._8_4_ = fVar248 * (float)uStack_4b8;
    auVar278._12_4_ = fVar249 * uStack_4b8._4_4_;
    auVar278._16_4_ = fVar250 * (float)uStack_4b0;
    auVar278._20_4_ = fVar251 * uStack_4b0._4_4_;
    auVar278._24_4_ = fVar217 * (float)uStack_4a8;
    auVar278._28_4_ = auVar15._28_4_;
    auVar67._4_4_ = uStack_51c;
    auVar67._0_4_ = local_520;
    auVar67._8_4_ = uStack_518;
    auVar67._12_4_ = uStack_514;
    auVar67._16_4_ = uStack_510;
    auVar67._20_4_ = uStack_50c;
    auVar67._24_4_ = uStack_508;
    auVar67._28_4_ = uStack_504;
    auVar109 = vfmadd231ps_fma(auVar23,auVar22,auVar67);
    auVar77._8_8_ = uStack_418;
    auVar77._0_8_ = local_420;
    auVar77._16_8_ = uStack_410;
    auVar77._24_8_ = uStack_408;
    auVar140 = vfmadd231ps_fma(auVar152,auVar22,auVar77);
    auVar75._8_8_ = uStack_438;
    auVar75._0_8_ = local_440;
    auVar75._16_8_ = uStack_430;
    auVar75._24_8_ = uStack_428;
    auVar141 = vfmadd231ps_fma(auVar180,auVar22,auVar75);
    auVar73._8_8_ = uStack_458;
    auVar73._0_8_ = local_460;
    auVar73._16_8_ = uStack_450;
    auVar73._24_8_ = uStack_448;
    auVar116 = vfmadd231ps_fma(auVar278,auVar22,auVar73);
    auVar69._4_4_ = uStack_4fc;
    auVar69._0_4_ = local_500;
    auVar69._8_4_ = uStack_4f8;
    auVar69._12_4_ = uStack_4f4;
    auVar69._16_4_ = uStack_4f0;
    auVar69._20_4_ = uStack_4ec;
    auVar69._24_4_ = uStack_4e8;
    auVar69._28_4_ = uStack_4e4;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar21,auVar69);
    auVar83._8_8_ = uStack_3b8;
    auVar83._0_8_ = local_3c0;
    auVar83._16_8_ = uStack_3b0;
    auVar83._24_8_ = uStack_3a8;
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar21,auVar83);
    auVar81._8_8_ = uStack_3d8;
    auVar81._0_8_ = local_3e0;
    auVar81._16_8_ = uStack_3d0;
    auVar81._24_8_ = uStack_3c8;
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar21,auVar81);
    auVar79._8_8_ = uStack_3f8;
    auVar79._0_8_ = local_400;
    auVar79._16_8_ = uStack_3f0;
    auVar79._24_8_ = uStack_3e8;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar21,auVar79);
    auVar71._4_4_ = uStack_4dc;
    auVar71._0_4_ = local_4e0;
    auVar71._8_4_ = uStack_4d8;
    auVar71._12_4_ = uStack_4d4;
    auVar71._16_4_ = uStack_4d0;
    auVar71._20_4_ = uStack_4cc;
    auVar71._24_4_ = uStack_4c8;
    auVar71._28_4_ = uStack_4c4;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar20,auVar71);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar20,auVar90);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar20,auVar89);
    auVar85._8_8_ = uStack_398;
    auVar85._0_8_ = local_3a0;
    auVar85._16_8_ = uStack_390;
    auVar85._24_8_ = uStack_388;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar20,auVar85);
    auVar269._0_4_ = auVar109._0_4_ * fVar202;
    auVar269._4_4_ = auVar109._4_4_ * fVar202;
    auVar269._8_4_ = auVar109._8_4_ * fVar202;
    auVar269._12_4_ = auVar109._12_4_ * fVar202;
    auVar269._16_4_ = fVar202 * 0.0;
    auVar269._20_4_ = fVar202 * 0.0;
    auVar269._24_4_ = fVar202 * 0.0;
    auVar269._28_4_ = 0;
    fVar250 = auVar140._0_4_ * fVar202;
    fVar217 = auVar140._4_4_ * fVar202;
    auVar242._4_4_ = fVar217;
    auVar242._0_4_ = fVar250;
    fVar228 = auVar140._8_4_ * fVar202;
    auVar242._8_4_ = fVar228;
    fVar285 = auVar140._12_4_ * fVar202;
    auVar242._12_4_ = fVar285;
    auVar242._16_4_ = fVar202 * 0.0;
    auVar242._20_4_ = fVar202 * 0.0;
    auVar242._24_4_ = fVar202 * 0.0;
    auVar242._28_4_ = fVar215 + fVar215;
    fVar297 = auVar141._0_4_ * fVar202;
    fVar299 = auVar141._4_4_ * fVar202;
    auVar298._4_4_ = fVar299;
    auVar298._0_4_ = fVar297;
    fVar300 = auVar141._8_4_ * fVar202;
    auVar298._8_4_ = fVar300;
    fVar301 = auVar141._12_4_ * fVar202;
    auVar298._12_4_ = fVar301;
    fVar302 = fVar202 * 0.0;
    auVar298._16_4_ = fVar302;
    fVar303 = fVar202 * 0.0;
    auVar298._20_4_ = fVar303;
    fVar304 = fVar202 * 0.0;
    auVar298._24_4_ = fVar304;
    auVar298._28_4_ = 0x3f000000;
    fVar237 = fVar202 * auVar116._0_4_;
    fVar247 = fVar202 * auVar116._4_4_;
    auVar7._4_4_ = fVar247;
    auVar7._0_4_ = fVar237;
    fVar248 = fVar202 * auVar116._8_4_;
    auVar7._8_4_ = fVar248;
    fVar249 = fVar202 * auVar116._12_4_;
    auVar7._12_4_ = fVar249;
    auVar7._16_4_ = fVar202 * 0.0;
    auVar7._20_4_ = fVar202 * 0.0;
    auVar7._24_4_ = fVar202 * 0.0;
    auVar7._28_4_ = fVar105;
    local_900 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar107));
    _local_920 = vpermps_avx2(_DAT_01fec480,auVar122);
    auVar213 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar108));
    auVar16 = vsubps_avx(local_900,ZEXT1632(auVar107));
    auVar17 = vsubps_avx(auVar213,ZEXT1632(auVar108));
    fVar251 = auVar17._0_4_;
    fVar215 = auVar17._4_4_;
    auVar12._4_4_ = fVar215 * auVar269._4_4_;
    auVar12._0_4_ = fVar251 * auVar269._0_4_;
    fVar226 = auVar17._8_4_;
    auVar12._8_4_ = fVar226 * auVar269._8_4_;
    fVar227 = auVar17._12_4_;
    auVar12._12_4_ = fVar227 * auVar269._12_4_;
    fVar229 = auVar17._16_4_;
    auVar12._16_4_ = fVar229 * auVar269._16_4_;
    fVar230 = auVar17._20_4_;
    auVar12._20_4_ = fVar230 * auVar269._20_4_;
    fVar231 = auVar17._24_4_;
    auVar12._24_4_ = fVar231 * auVar269._24_4_;
    auVar12._28_4_ = local_900._28_4_;
    auVar109 = vfmsub231ps_fma(auVar12,auVar298,auVar16);
    local_240 = vsubps_avx(_local_920,auVar122);
    fVar265 = auVar16._0_4_;
    fVar266 = auVar16._4_4_;
    auVar14._4_4_ = fVar266 * fVar217;
    auVar14._0_4_ = fVar265 * fVar250;
    fVar267 = auVar16._8_4_;
    auVar14._8_4_ = fVar267 * fVar228;
    fVar290 = auVar16._12_4_;
    auVar14._12_4_ = fVar290 * fVar285;
    fVar291 = auVar16._16_4_;
    auVar14._16_4_ = fVar291 * fVar202 * 0.0;
    fVar292 = auVar16._20_4_;
    auVar14._20_4_ = fVar292 * fVar202 * 0.0;
    fVar293 = auVar16._24_4_;
    auVar14._24_4_ = fVar293 * fVar202 * 0.0;
    auVar14._28_4_ = local_920._28_4_;
    auVar140 = vfmsub231ps_fma(auVar14,auVar269,local_240);
    auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar140._12_4_ * auVar140._12_4_,
                                                  CONCAT48(auVar140._8_4_ * auVar140._8_4_,
                                                           CONCAT44(auVar140._4_4_ * auVar140._4_4_,
                                                                    auVar140._0_4_ * auVar140._0_4_)
                                                          ))),ZEXT1632(auVar109),ZEXT1632(auVar109))
    ;
    fVar217 = local_240._0_4_;
    fVar228 = local_240._4_4_;
    auVar26._4_4_ = fVar228 * fVar299;
    auVar26._0_4_ = fVar217 * fVar297;
    fVar285 = local_240._8_4_;
    auVar26._8_4_ = fVar285 * fVar300;
    fVar216 = local_240._12_4_;
    auVar26._12_4_ = fVar216 * fVar301;
    fVar232 = local_240._16_4_;
    auVar26._16_4_ = fVar232 * fVar302;
    fVar236 = local_240._20_4_;
    auVar26._20_4_ = fVar236 * fVar303;
    fVar252 = local_240._24_4_;
    auVar26._24_4_ = fVar252 * fVar304;
    auVar26._28_4_ = auVar213._28_4_;
    auVar141 = vfmsub231ps_fma(auVar26,auVar242,auVar17);
    auVar196._0_4_ = fVar251 * fVar251;
    auVar196._4_4_ = fVar215 * fVar215;
    auVar196._8_4_ = fVar226 * fVar226;
    auVar196._12_4_ = fVar227 * fVar227;
    auVar196._16_4_ = fVar229 * fVar229;
    auVar196._20_4_ = fVar230 * fVar230;
    auVar196._24_4_ = fVar231 * fVar231;
    auVar196._28_4_ = 0;
    auVar140 = vfmadd231ps_fma(auVar196,local_240,local_240);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar16,auVar16);
    auVar121 = vrcpps_avx(ZEXT1632(auVar140));
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar141),ZEXT1632(auVar141));
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = 0x3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar109 = vfnmadd213ps_fma(auVar121,ZEXT1632(auVar140),auVar123);
    auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar121,auVar121);
    local_780 = vpermps_avx2(_DAT_01fec480,auVar269);
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar298);
    auVar27._4_4_ = fVar215 * local_780._4_4_;
    auVar27._0_4_ = fVar251 * local_780._0_4_;
    auVar27._8_4_ = fVar226 * local_780._8_4_;
    auVar27._12_4_ = fVar227 * local_780._12_4_;
    auVar27._16_4_ = fVar229 * local_780._16_4_;
    auVar27._20_4_ = fVar230 * local_780._20_4_;
    auVar27._24_4_ = fVar231 * local_780._24_4_;
    auVar27._28_4_ = auVar121._28_4_;
    auVar116 = vfmsub231ps_fma(auVar27,auVar20,auVar16);
    auVar21 = vpermps_avx2(_DAT_01fec480,auVar242);
    auVar28._4_4_ = fVar266 * auVar21._4_4_;
    auVar28._0_4_ = fVar265 * auVar21._0_4_;
    auVar28._8_4_ = fVar267 * auVar21._8_4_;
    auVar28._12_4_ = fVar290 * auVar21._12_4_;
    auVar28._16_4_ = fVar291 * auVar21._16_4_;
    auVar28._20_4_ = fVar292 * auVar21._20_4_;
    auVar28._24_4_ = fVar293 * auVar21._24_4_;
    auVar28._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar28,local_780,local_240);
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar204._12_4_ * auVar204._12_4_,
                                                  CONCAT48(auVar204._8_4_ * auVar204._8_4_,
                                                           CONCAT44(auVar204._4_4_ * auVar204._4_4_,
                                                                    auVar204._0_4_ * auVar204._0_4_)
                                                          ))),ZEXT1632(auVar116),ZEXT1632(auVar116))
    ;
    auVar257._0_4_ = fVar217 * auVar20._0_4_;
    auVar257._4_4_ = fVar228 * auVar20._4_4_;
    auVar257._8_4_ = fVar285 * auVar20._8_4_;
    auVar257._12_4_ = fVar216 * auVar20._12_4_;
    auVar257._16_4_ = fVar232 * auVar20._16_4_;
    auVar257._20_4_ = fVar236 * auVar20._20_4_;
    auVar257._24_4_ = fVar252 * auVar20._24_4_;
    auVar257._28_4_ = 0;
    auVar204 = vfmsub231ps_fma(auVar257,auVar21,auVar17);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),ZEXT1632(auVar204),ZEXT1632(auVar204));
    auVar121 = vmaxps_avx(ZEXT1632(CONCAT412(auVar141._12_4_ * auVar109._12_4_,
                                             CONCAT48(auVar141._8_4_ * auVar109._8_4_,
                                                      CONCAT44(auVar141._4_4_ * auVar109._4_4_,
                                                               auVar141._0_4_ * auVar109._0_4_)))),
                          ZEXT1632(CONCAT412(auVar116._12_4_ * auVar109._12_4_,
                                             CONCAT48(auVar116._8_4_ * auVar109._8_4_,
                                                      CONCAT44(auVar116._4_4_ * auVar109._4_4_,
                                                               auVar116._0_4_ * auVar109._0_4_)))));
    auVar234._0_4_ = auVar162._0_4_ + fVar237;
    auVar234._4_4_ = auVar162._4_4_ + fVar247;
    auVar234._8_4_ = auVar162._8_4_ + fVar248;
    auVar234._12_4_ = auVar162._12_4_ + fVar249;
    auVar234._16_4_ = fVar202 * 0.0 + 0.0;
    auVar234._20_4_ = fVar202 * 0.0 + 0.0;
    auVar234._24_4_ = fVar202 * 0.0 + 0.0;
    auVar234._28_4_ = fVar105 + 0.0;
    auStack_7b0 = auVar234._16_16_;
    local_7a0 = ZEXT1632(auVar162);
    auVar224 = vsubps_avx(local_7a0,auVar7);
    auVar22 = vpermps_avx2(_DAT_01fec480,auVar224);
    auVar23 = vpermps_avx2(_DAT_01fec480,local_7a0);
    auVar224 = vmaxps_avx(local_7a0,auVar234);
    auVar15 = vmaxps_avx(auVar22,auVar23);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar140));
    auVar224 = vmaxps_avx(auVar224,auVar15);
    fVar202 = auVar13._0_4_;
    fVar105 = auVar13._4_4_;
    fVar237 = auVar13._8_4_;
    fVar247 = auVar13._12_4_;
    fVar248 = auVar13._16_4_;
    fVar249 = auVar13._20_4_;
    fVar250 = auVar13._24_4_;
    auVar29._4_4_ = fVar105 * fVar105 * fVar105 * auVar140._4_4_ * -0.5;
    auVar29._0_4_ = fVar202 * fVar202 * fVar202 * auVar140._0_4_ * -0.5;
    auVar29._8_4_ = fVar237 * fVar237 * fVar237 * auVar140._8_4_ * -0.5;
    auVar29._12_4_ = fVar247 * fVar247 * fVar247 * auVar140._12_4_ * -0.5;
    auVar29._16_4_ = fVar248 * fVar248 * fVar248 * -0.0;
    auVar29._20_4_ = fVar249 * fVar249 * fVar249 * -0.0;
    auVar29._24_4_ = fVar250 * fVar250 * fVar250 * -0.0;
    auVar29._28_4_ = auVar22._28_4_;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_fma(auVar29,auVar124,auVar13);
    auVar246 = ZEXT1664(auVar109);
    fVar105 = auVar109._0_4_;
    fVar247 = auVar109._4_4_;
    auVar30._4_4_ = fVar228 * fVar247;
    auVar30._0_4_ = fVar217 * fVar105;
    fVar250 = auVar109._8_4_;
    auVar30._8_4_ = fVar285 * fVar250;
    fVar217 = auVar109._12_4_;
    auVar30._12_4_ = fVar216 * fVar217;
    auVar30._16_4_ = fVar232 * 0.0;
    auVar30._20_4_ = fVar236 * 0.0;
    auVar30._24_4_ = fVar252 * 0.0;
    auVar30._28_4_ = 0;
    auVar31._4_4_ = fVar215 * fVar247 * (float)local_980._4_4_;
    auVar31._0_4_ = fVar251 * fVar105 * (float)local_980._0_4_;
    auVar31._8_4_ = fVar226 * fVar250 * fStack_978;
    auVar31._12_4_ = fVar227 * fVar217 * fStack_974;
    auVar31._16_4_ = fVar229 * 0.0 * fStack_970;
    auVar31._20_4_ = fVar230 * 0.0 * fStack_96c;
    auVar31._24_4_ = fVar231 * 0.0 * fStack_968;
    auVar31._28_4_ = local_240._28_4_;
    auVar162 = vfmadd231ps_fma(auVar31,auVar30,_local_a20);
    auVar180 = ZEXT1632(auVar108);
    auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar180);
    fVar237 = auVar15._0_4_;
    fVar248 = auVar15._4_4_;
    auVar32._4_4_ = fVar215 * fVar247 * fVar248;
    auVar32._0_4_ = fVar251 * fVar105 * fVar237;
    fVar251 = auVar15._8_4_;
    auVar32._8_4_ = fVar226 * fVar250 * fVar251;
    fVar226 = auVar15._12_4_;
    auVar32._12_4_ = fVar227 * fVar217 * fVar226;
    fVar228 = auVar15._16_4_;
    auVar32._16_4_ = fVar229 * 0.0 * fVar228;
    fVar229 = auVar15._20_4_;
    auVar32._20_4_ = fVar230 * 0.0 * fVar229;
    fVar230 = auVar15._24_4_;
    auVar32._24_4_ = fVar231 * 0.0 * fVar230;
    auVar32._28_4_ = auVar20._28_4_;
    auVar130 = vsubps_avx(ZEXT832(0) << 0x20,auVar122);
    auVar108 = vfmadd231ps_fma(auVar32,auVar130,auVar30);
    auVar33._4_4_ = fVar266 * fVar247;
    auVar33._0_4_ = fVar265 * fVar105;
    auVar33._8_4_ = fVar267 * fVar250;
    auVar33._12_4_ = fVar290 * fVar217;
    auVar33._16_4_ = fVar291 * 0.0;
    auVar33._20_4_ = fVar292 * 0.0;
    auVar33._24_4_ = fVar293 * 0.0;
    auVar33._28_4_ = 0;
    auVar162 = vfmadd231ps_fma(ZEXT1632(auVar162),auVar33,_local_7e0);
    auVar279 = ZEXT1664(auVar162);
    auVar152 = ZEXT1632(auVar107);
    auVar155 = vsubps_avx(ZEXT832(0) << 0x20,auVar152);
    auVar284 = ZEXT3264(auVar155);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar155,auVar33);
    auVar34._4_4_ = (float)local_980._4_4_ * fVar248;
    auVar34._0_4_ = (float)local_980._0_4_ * fVar237;
    auVar34._8_4_ = fStack_978 * fVar251;
    auVar34._12_4_ = fStack_974 * fVar226;
    auVar34._16_4_ = fStack_970 * fVar228;
    auVar34._20_4_ = fStack_96c * fVar229;
    auVar34._24_4_ = fStack_968 * fVar230;
    auVar34._28_4_ = 0;
    auVar140 = vfmadd231ps_fma(auVar34,_local_a20,auVar130);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),_local_7e0,auVar155);
    fVar202 = auVar108._0_4_;
    fVar232 = auVar162._0_4_;
    fVar249 = auVar108._4_4_;
    fVar236 = auVar162._4_4_;
    fVar215 = auVar108._8_4_;
    fVar252 = auVar162._8_4_;
    fVar227 = auVar108._12_4_;
    fVar265 = auVar162._12_4_;
    auVar35._28_4_ = auVar13._28_4_;
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(fVar265 * fVar227,
                            CONCAT48(fVar252 * fVar215,CONCAT44(fVar236 * fVar249,fVar232 * fVar202)
                                    )));
    auVar18 = vsubps_avx(ZEXT1632(auVar140),auVar35);
    auVar36._4_4_ = fVar248 * fVar248;
    auVar36._0_4_ = fVar237 * fVar237;
    auVar36._8_4_ = fVar251 * fVar251;
    auVar36._12_4_ = fVar226 * fVar226;
    auVar36._16_4_ = fVar228 * fVar228;
    auVar36._20_4_ = fVar229 * fVar229;
    auVar36._24_4_ = fVar230 * fVar230;
    auVar36._28_4_ = auVar13._28_4_;
    auVar140 = vfmadd231ps_fma(auVar36,auVar130,auVar130);
    auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar155,auVar155);
    auVar91._28_4_ = DAT_01fec480._28_4_;
    auVar91._0_28_ =
         ZEXT1628(CONCAT412(fVar227 * fVar227,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar249 * fVar249,fVar202 * fVar202)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar140),auVar91);
    auVar15 = vsqrtps_avx(auVar121);
    fVar202 = (auVar15._0_4_ + auVar224._0_4_) * 1.0000002;
    fVar249 = (auVar15._4_4_ + auVar224._4_4_) * 1.0000002;
    fVar215 = (auVar15._8_4_ + auVar224._8_4_) * 1.0000002;
    fVar227 = (auVar15._12_4_ + auVar224._12_4_) * 1.0000002;
    fVar231 = (auVar15._16_4_ + auVar224._16_4_) * 1.0000002;
    fVar285 = (auVar15._20_4_ + auVar224._20_4_) * 1.0000002;
    fVar216 = (auVar15._24_4_ + auVar224._24_4_) * 1.0000002;
    auVar37._4_4_ = fVar249 * fVar249;
    auVar37._0_4_ = fVar202 * fVar202;
    auVar37._8_4_ = fVar215 * fVar215;
    auVar37._12_4_ = fVar227 * fVar227;
    auVar37._16_4_ = fVar231 * fVar231;
    auVar37._20_4_ = fVar285 * fVar285;
    auVar37._24_4_ = fVar216 * fVar216;
    auVar37._28_4_ = auVar15._28_4_ + auVar224._28_4_;
    auVar153._0_4_ = auVar18._0_4_ + auVar18._0_4_;
    auVar153._4_4_ = auVar18._4_4_ + auVar18._4_4_;
    auVar153._8_4_ = auVar18._8_4_ + auVar18._8_4_;
    auVar153._12_4_ = auVar18._12_4_ + auVar18._12_4_;
    auVar153._16_4_ = auVar18._16_4_ + auVar18._16_4_;
    auVar153._20_4_ = auVar18._20_4_ + auVar18._20_4_;
    auVar153._24_4_ = auVar18._24_4_ + auVar18._24_4_;
    fVar202 = auVar18._28_4_;
    auVar153._28_4_ = fVar202 + fVar202;
    auVar224 = vsubps_avx(auVar13,auVar37);
    auVar278 = ZEXT1632(auVar162);
    local_260._28_4_ = local_a20._28_4_;
    local_260._0_28_ =
         ZEXT1628(CONCAT412(fVar265 * fVar265,
                            CONCAT48(fVar252 * fVar252,CONCAT44(fVar236 * fVar236,fVar232 * fVar232)
                                    )));
    local_960 = vsubps_avx(local_220,local_260);
    auVar38._4_4_ = auVar153._4_4_ * auVar153._4_4_;
    auVar38._0_4_ = auVar153._0_4_ * auVar153._0_4_;
    auVar38._8_4_ = auVar153._8_4_ * auVar153._8_4_;
    auVar38._12_4_ = auVar153._12_4_ * auVar153._12_4_;
    auVar38._16_4_ = auVar153._16_4_ * auVar153._16_4_;
    auVar38._20_4_ = auVar153._20_4_ * auVar153._20_4_;
    auVar38._24_4_ = auVar153._24_4_ * auVar153._24_4_;
    auVar38._28_4_ = auVar16._28_4_;
    fVar249 = local_960._0_4_;
    fVar215 = local_960._4_4_;
    fVar227 = local_960._8_4_;
    fVar231 = local_960._12_4_;
    fVar285 = local_960._16_4_;
    fVar216 = local_960._20_4_;
    fVar232 = local_960._24_4_;
    auVar39._4_4_ = fVar215 * 4.0 * auVar224._4_4_;
    auVar39._0_4_ = fVar249 * 4.0 * auVar224._0_4_;
    auVar39._8_4_ = fVar227 * 4.0 * auVar224._8_4_;
    auVar39._12_4_ = fVar231 * 4.0 * auVar224._12_4_;
    auVar39._16_4_ = fVar285 * 4.0 * auVar224._16_4_;
    auVar39._20_4_ = fVar216 * 4.0 * auVar224._20_4_;
    auVar39._24_4_ = fVar232 * 4.0 * auVar224._24_4_;
    auVar39._28_4_ = fVar202;
    auVar18 = vsubps_avx(auVar38,auVar39);
    auVar121 = vcmpps_avx(auVar18,ZEXT432(0) << 0x20,5);
    auVar298 = ZEXT1632(auVar108);
    fVar202 = local_960._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar296._8_4_ = 0x7f800000;
      auVar296._0_8_ = 0x7f8000007f800000;
      auVar296._12_4_ = 0x7f800000;
      auVar296._16_4_ = 0x7f800000;
      auVar296._20_4_ = 0x7f800000;
      auVar296._24_4_ = 0x7f800000;
      auVar296._28_4_ = 0x7f800000;
      auVar197._8_4_ = 0xff800000;
      auVar197._0_8_ = 0xff800000ff800000;
      auVar197._12_4_ = 0xff800000;
      auVar197._16_4_ = 0xff800000;
      auVar197._20_4_ = 0xff800000;
      auVar197._24_4_ = 0xff800000;
      auVar197._28_4_ = 0xff800000;
      auVar18 = local_220;
    }
    else {
      auVar14 = vsqrtps_avx(auVar18);
      auVar286._0_4_ = fVar249 + fVar249;
      auVar286._4_4_ = fVar215 + fVar215;
      auVar286._8_4_ = fVar227 + fVar227;
      auVar286._12_4_ = fVar231 + fVar231;
      auVar286._16_4_ = fVar285 + fVar285;
      auVar286._20_4_ = fVar216 + fVar216;
      auVar286._24_4_ = fVar232 + fVar232;
      auVar286._28_4_ = fVar202 + fVar202;
      auVar12 = vrcpps_avx(auVar286);
      auVar7 = vcmpps_avx(auVar18,ZEXT832(0) << 0x20,5);
      auVar125._8_4_ = 0x3f800000;
      auVar125._0_8_ = 0x3f8000003f800000;
      auVar125._12_4_ = 0x3f800000;
      auVar125._16_4_ = 0x3f800000;
      auVar125._20_4_ = 0x3f800000;
      auVar125._24_4_ = 0x3f800000;
      auVar125._28_4_ = 0x3f800000;
      auVar108 = vfnmadd213ps_fma(auVar286,auVar12,auVar125);
      auVar108 = vfmadd132ps_fma(ZEXT1632(auVar108),auVar12,auVar12);
      auVar198._0_4_ = (uint)auVar153._0_4_ ^ local_800;
      auVar198._4_4_ = (uint)auVar153._4_4_ ^ uStack_7fc;
      auVar198._8_4_ = (uint)auVar153._8_4_ ^ uStack_7f8;
      auVar198._12_4_ = (uint)auVar153._12_4_ ^ uStack_7f4;
      auVar198._16_4_ = (uint)auVar153._16_4_ ^ (uint)fStack_7f0;
      auVar198._20_4_ = (uint)auVar153._20_4_ ^ (uint)fStack_7ec;
      auVar198._24_4_ = (uint)auVar153._24_4_ ^ (uint)fStack_7e8;
      auVar198._28_4_ = (uint)auVar153._28_4_ ^ uStack_7e4;
      auVar18 = vsubps_avx(auVar198,auVar14);
      auVar40._4_4_ = auVar108._4_4_ * auVar18._4_4_;
      auVar40._0_4_ = auVar108._0_4_ * auVar18._0_4_;
      auVar40._8_4_ = auVar108._8_4_ * auVar18._8_4_;
      auVar40._12_4_ = auVar108._12_4_ * auVar18._12_4_;
      auVar40._16_4_ = auVar18._16_4_ * 0.0;
      auVar40._20_4_ = auVar18._20_4_ * 0.0;
      auVar40._24_4_ = auVar18._24_4_ * 0.0;
      auVar40._28_4_ = auVar18._28_4_;
      auVar18 = vsubps_avx(auVar14,auVar153);
      auVar41._4_4_ = auVar108._4_4_ * auVar18._4_4_;
      auVar41._0_4_ = auVar108._0_4_ * auVar18._0_4_;
      auVar41._8_4_ = auVar108._8_4_ * auVar18._8_4_;
      auVar41._12_4_ = auVar108._12_4_ * auVar18._12_4_;
      auVar41._16_4_ = auVar18._16_4_ * 0.0;
      auVar41._20_4_ = auVar18._20_4_ * 0.0;
      auVar41._24_4_ = auVar18._24_4_ * 0.0;
      auVar41._28_4_ = auVar18._28_4_;
      auVar108 = vfmadd213ps_fma(auVar278,auVar40,auVar298);
      local_2c0 = auVar108._0_4_ * fVar105;
      fStack_2bc = auVar108._4_4_ * fVar247;
      fStack_2b8 = auVar108._8_4_ * fVar250;
      fStack_2b4 = auVar108._12_4_ * fVar217;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      uStack_2a8 = 0;
      uStack_2a4 = 0x3f800000;
      auVar62._4_4_ = uStack_81c;
      auVar62._0_4_ = local_820;
      auVar62._8_4_ = uStack_818;
      auVar62._12_4_ = uStack_814;
      auVar62._16_4_ = uStack_810;
      auVar62._20_4_ = uStack_80c;
      auVar62._24_4_ = uStack_808;
      auVar62._28_4_ = uStack_804;
      auVar18 = vandps_avx(local_260,auVar62);
      auVar18 = vmaxps_avx(local_560,auVar18);
      auVar42._4_4_ = auVar18._4_4_ * 1.9073486e-06;
      auVar42._0_4_ = auVar18._0_4_ * 1.9073486e-06;
      auVar42._8_4_ = auVar18._8_4_ * 1.9073486e-06;
      auVar42._12_4_ = auVar18._12_4_ * 1.9073486e-06;
      auVar42._16_4_ = auVar18._16_4_ * 1.9073486e-06;
      auVar42._20_4_ = auVar18._20_4_ * 1.9073486e-06;
      auVar42._24_4_ = auVar18._24_4_ * 1.9073486e-06;
      auVar42._28_4_ = auVar18._28_4_;
      auVar18 = vandps_avx(auVar62,local_960);
      auVar18 = vcmpps_avx(auVar18,auVar42,1);
      auVar108 = vfmadd213ps_fma(auVar278,auVar41,auVar298);
      auVar126._8_4_ = 0x7f800000;
      auVar126._0_8_ = 0x7f8000007f800000;
      auVar126._12_4_ = 0x7f800000;
      auVar126._16_4_ = 0x7f800000;
      auVar126._20_4_ = 0x7f800000;
      auVar126._24_4_ = 0x7f800000;
      auVar126._28_4_ = 0x7f800000;
      auVar296 = vblendvps_avx(auVar126,auVar40,auVar7);
      local_2e0 = auVar108._0_4_ * fVar105;
      fStack_2dc = auVar108._4_4_ * fVar247;
      fStack_2d8 = auVar108._8_4_ * fVar250;
      fStack_2d4 = auVar108._12_4_ * fVar217;
      uStack_2d0 = 0;
      uStack_2cc = 0;
      uStack_2c8 = 0;
      uStack_2c4 = 0x7f800000;
      auVar127._8_4_ = 0xff800000;
      auVar127._0_8_ = 0xff800000ff800000;
      auVar127._12_4_ = 0xff800000;
      auVar127._16_4_ = 0xff800000;
      auVar127._20_4_ = 0xff800000;
      auVar127._24_4_ = 0xff800000;
      auVar127._28_4_ = 0xff800000;
      auVar197 = vblendvps_avx(auVar127,auVar41,auVar7);
      auVar12 = auVar7 & auVar18;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar121 = vandps_avx(auVar18,auVar7);
        auVar12 = vcmpps_avx(auVar224,ZEXT832(0) << 0x20,2);
        auVar246 = ZEXT3264(auVar12);
        auVar160._8_4_ = 0xff800000;
        auVar160._0_8_ = 0xff800000ff800000;
        auVar160._12_4_ = 0xff800000;
        auVar160._16_4_ = 0xff800000;
        auVar160._20_4_ = 0xff800000;
        auVar160._24_4_ = 0xff800000;
        auVar160._28_4_ = 0xff800000;
        auVar137._8_4_ = 0x7f800000;
        auVar137._0_8_ = 0x7f8000007f800000;
        auVar137._12_4_ = 0x7f800000;
        auVar137._16_4_ = 0x7f800000;
        auVar137._20_4_ = 0x7f800000;
        auVar137._24_4_ = 0x7f800000;
        auVar137._28_4_ = 0x7f800000;
        auVar224 = vblendvps_avx(auVar137,auVar160,auVar12);
        auVar108 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar18 = vpmovsxwd_avx2(auVar108);
        auVar296 = vblendvps_avx(auVar296,auVar224,auVar18);
        auVar224 = vblendvps_avx(auVar160,auVar137,auVar12);
        auVar197 = vblendvps_avx(auVar197,auVar224,auVar18);
        auVar214._0_8_ = auVar121._0_8_ ^ 0xffffffffffffffff;
        auVar214._8_4_ = auVar121._8_4_ ^ 0xffffffff;
        auVar214._12_4_ = auVar121._12_4_ ^ 0xffffffff;
        auVar214._16_4_ = auVar121._16_4_ ^ 0xffffffff;
        auVar214._20_4_ = auVar121._20_4_ ^ 0xffffffff;
        auVar214._24_4_ = auVar121._24_4_ ^ 0xffffffff;
        auVar214._28_4_ = auVar121._28_4_ ^ 0xffffffff;
        auVar121 = vorps_avx(auVar12,auVar214);
        auVar121 = vandps_avx(auVar7,auVar121);
      }
    }
    auVar264 = ZEXT3264(auVar18);
    auVar271 = ZEXT3264(ZEXT1632(auVar109));
    auVar289 = ZEXT3264(local_540);
    auVar224 = local_540 & auVar121;
    fVar236 = (float)local_a00._0_4_;
    fVar252 = (float)local_a00._4_4_;
    fVar265 = fStack_9f8;
    fVar266 = fStack_9f4;
    fVar267 = fStack_9f0;
    fVar290 = fStack_9ec;
    fVar291 = fStack_9e8;
    fVar292 = fStack_9e4;
    if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar224 >> 0x7f,0) != '\0') ||
          (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar224 >> 0xbf,0) != '\0') ||
        (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar224[0x1f] < '\0') {
      local_300 = ZEXT1632(auVar109);
      fVar293 = *(float *)(ray + k * 4 + 0x80);
      local_590 = ZEXT416((uint)fVar293);
      fVar19 = fVar293 - (float)local_8b0._0_4_;
      auVar212._4_4_ = fVar19;
      auVar212._0_4_ = fVar19;
      auVar212._8_4_ = fVar19;
      auVar212._12_4_ = fVar19;
      auVar212._16_4_ = fVar19;
      auVar212._20_4_ = fVar19;
      auVar212._24_4_ = fVar19;
      auVar212._28_4_ = fVar19;
      auVar7 = vminps_avx(auVar212,auVar197);
      auVar43._4_4_ = fVar248 * fVar299;
      auVar43._0_4_ = fVar237 * fVar297;
      auVar43._8_4_ = fVar251 * fVar300;
      auVar43._12_4_ = fVar226 * fVar301;
      auVar43._16_4_ = fVar228 * fVar302;
      auVar43._20_4_ = fVar229 * fVar303;
      auVar43._24_4_ = fVar230 * fVar304;
      auVar43._28_4_ = fVar19;
      auVar109 = vfmadd213ps_fma(auVar130,auVar242,auVar43);
      auVar88._4_4_ = fStack_29c;
      auVar88._0_4_ = local_2a0;
      auVar88._8_4_ = fStack_298;
      auVar88._12_4_ = fStack_294;
      auVar88._16_4_ = fStack_290;
      auVar88._20_4_ = fStack_28c;
      auVar88._24_4_ = fStack_288;
      auVar88._28_4_ = fStack_284;
      auVar18 = vmaxps_avx(auVar88,auVar296);
      auVar108 = vfmadd213ps_fma(auVar155,auVar269,ZEXT1632(auVar109));
      auVar44._4_4_ = (float)local_980._4_4_ * fVar299;
      auVar44._0_4_ = (float)local_980._0_4_ * fVar297;
      auVar44._8_4_ = fStack_978 * fVar300;
      auVar44._12_4_ = fStack_974 * fVar301;
      auVar44._16_4_ = fStack_970 * fVar302;
      auVar44._20_4_ = fStack_96c * fVar303;
      auVar44._24_4_ = fStack_968 * fVar304;
      auVar44._28_4_ = 0x3f000000;
      auVar109 = vfmadd231ps_fma(auVar44,_local_a20,auVar242);
      auVar162 = vfmadd231ps_fma(ZEXT1632(auVar109),_local_7e0,auVar269);
      auVar63._4_4_ = uStack_81c;
      auVar63._0_4_ = local_820;
      auVar63._8_4_ = uStack_818;
      auVar63._12_4_ = uStack_814;
      auVar63._16_4_ = uStack_810;
      auVar63._20_4_ = uStack_80c;
      auVar63._24_4_ = uStack_808;
      auVar63._28_4_ = uStack_804;
      auVar224 = vandps_avx(auVar63,ZEXT1632(auVar162));
      auVar128._8_4_ = 0x219392ef;
      auVar128._0_8_ = 0x219392ef219392ef;
      auVar128._12_4_ = 0x219392ef;
      auVar128._16_4_ = 0x219392ef;
      auVar128._20_4_ = 0x219392ef;
      auVar128._24_4_ = 0x219392ef;
      auVar128._28_4_ = 0x219392ef;
      auVar130 = vcmpps_avx(auVar224,auVar128,1);
      auVar224 = vrcpps_avx(ZEXT1632(auVar162));
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      auVar270._16_4_ = 0x3f800000;
      auVar270._20_4_ = 0x3f800000;
      auVar270._24_4_ = 0x3f800000;
      auVar270._28_4_ = 0x3f800000;
      auVar271 = ZEXT3264(auVar270);
      auVar242 = ZEXT1632(auVar162);
      auVar109 = vfnmadd213ps_fma(auVar224,auVar242,auVar270);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar224,auVar224);
      auVar287._0_4_ = auVar162._0_4_ ^ local_800;
      auVar287._4_4_ = auVar162._4_4_ ^ uStack_7fc;
      auVar287._8_4_ = auVar162._8_4_ ^ uStack_7f8;
      auVar287._12_4_ = auVar162._12_4_ ^ uStack_7f4;
      auVar287._16_4_ = fStack_7f0;
      auVar287._20_4_ = fStack_7ec;
      auVar287._24_4_ = fStack_7e8;
      auVar287._28_4_ = uStack_7e4;
      auVar45._4_4_ = auVar109._4_4_ * (float)(auVar108._4_4_ ^ uStack_7fc);
      auVar45._0_4_ = auVar109._0_4_ * (float)(auVar108._0_4_ ^ local_800);
      auVar45._8_4_ = auVar109._8_4_ * (float)(auVar108._8_4_ ^ uStack_7f8);
      auVar45._12_4_ = auVar109._12_4_ * (float)(auVar108._12_4_ ^ uStack_7f4);
      auVar45._16_4_ = fStack_7f0 * 0.0;
      auVar45._20_4_ = fStack_7ec * 0.0;
      auVar45._24_4_ = fStack_7e8 * 0.0;
      auVar45._28_4_ = uStack_7e4;
      auVar224 = vcmpps_avx(auVar242,auVar287,1);
      auVar224 = vorps_avx(auVar130,auVar224);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar45,auVar281,auVar224);
      auVar155 = vmaxps_avx(auVar18,auVar224);
      auVar224 = vcmpps_avx(auVar242,auVar287,6);
      auVar289 = ZEXT3264(local_540);
      auVar224 = vorps_avx(auVar130,auVar224);
      auVar243._8_4_ = 0x7f800000;
      auVar243._0_8_ = 0x7f8000007f800000;
      auVar243._12_4_ = 0x7f800000;
      auVar243._16_4_ = 0x7f800000;
      auVar243._20_4_ = 0x7f800000;
      auVar243._24_4_ = 0x7f800000;
      auVar243._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar45,auVar243,auVar224);
      local_940 = vminps_avx(auVar7,auVar224);
      fVar237 = (float)(local_800 ^ (uint)auVar20._0_4_);
      fVar248 = (float)(uStack_7fc ^ (uint)auVar20._4_4_);
      fVar251 = (float)(uStack_7f8 ^ (uint)auVar20._8_4_);
      fVar226 = (float)(uStack_7f4 ^ (uint)auVar20._12_4_);
      fVar228 = (float)((uint)fStack_7f0 ^ (uint)auVar20._16_4_);
      fVar229 = (float)((uint)fStack_7ec ^ (uint)auVar20._20_4_);
      fVar230 = (float)((uint)fStack_7e8 ^ (uint)auVar20._24_4_);
      uStack_b44 = auVar21._28_4_;
      auVar244._0_4_ = local_800 ^ (uint)auVar21._0_4_;
      auVar244._4_4_ = uStack_7fc ^ (uint)auVar21._4_4_;
      auVar244._8_4_ = uStack_7f8 ^ (uint)auVar21._8_4_;
      auVar244._12_4_ = uStack_7f4 ^ (uint)auVar21._12_4_;
      auVar244._16_4_ = (uint)fStack_7f0 ^ (uint)auVar21._16_4_;
      auVar244._20_4_ = (uint)fStack_7ec ^ (uint)auVar21._20_4_;
      auVar244._24_4_ = (uint)fStack_7e8 ^ (uint)auVar21._24_4_;
      auVar244._28_4_ = uStack_7e4 ^ uStack_b44;
      auVar130 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar224 = vsubps_avx(auVar130,_local_920);
      auVar130 = vsubps_avx(auVar130,auVar213);
      auVar46._4_4_ = auVar130._4_4_ * fVar248;
      auVar46._0_4_ = auVar130._0_4_ * fVar237;
      auVar46._8_4_ = auVar130._8_4_ * fVar251;
      auVar46._12_4_ = auVar130._12_4_ * fVar226;
      auVar46._16_4_ = auVar130._16_4_ * fVar228;
      auVar46._20_4_ = auVar130._20_4_ * fVar229;
      auVar46._24_4_ = auVar130._24_4_ * fVar230;
      auVar46._28_4_ = auVar130._28_4_;
      auVar109 = vfmadd231ps_fma(auVar46,auVar244,auVar224);
      auVar258._0_4_ = local_800 ^ (uint)local_780._0_4_;
      auVar258._4_4_ = uStack_7fc ^ (uint)local_780._4_4_;
      auVar258._8_4_ = uStack_7f8 ^ (uint)local_780._8_4_;
      auVar258._12_4_ = uStack_7f4 ^ (uint)local_780._12_4_;
      auVar258._16_4_ = (uint)fStack_7f0 ^ (uint)local_780._16_4_;
      auVar258._20_4_ = (uint)fStack_7ec ^ (uint)local_780._20_4_;
      auVar258._24_4_ = (uint)fStack_7e8 ^ (uint)local_780._24_4_;
      auVar258._28_4_ = uStack_7e4 ^ local_780._28_4_;
      auVar224 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,local_900);
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar258,auVar224);
      auVar47._4_4_ = (float)local_980._4_4_ * fVar248;
      auVar47._0_4_ = (float)local_980._0_4_ * fVar237;
      auVar47._8_4_ = fStack_978 * fVar251;
      auVar47._12_4_ = fStack_974 * fVar226;
      auVar47._16_4_ = fStack_970 * fVar228;
      auVar47._20_4_ = fStack_96c * fVar229;
      auVar47._24_4_ = fStack_968 * fVar230;
      auVar47._28_4_ = uStack_7e4 ^ auVar20._28_4_;
      auVar109 = vfmadd231ps_fma(auVar47,_local_a20,auVar244);
      auVar162 = vfmadd231ps_fma(ZEXT1632(auVar109),_local_7e0,auVar258);
      auVar224 = vandps_avx(auVar63,ZEXT1632(auVar162));
      auVar18 = vrcpps_avx(ZEXT1632(auVar162));
      auVar199._8_4_ = 0x219392ef;
      auVar199._0_8_ = 0x219392ef219392ef;
      auVar199._12_4_ = 0x219392ef;
      auVar199._16_4_ = 0x219392ef;
      auVar199._20_4_ = 0x219392ef;
      auVar199._24_4_ = 0x219392ef;
      auVar199._28_4_ = 0x219392ef;
      auVar130 = vcmpps_avx(auVar224,auVar199,1);
      auVar246 = ZEXT3264(auVar130);
      auVar213 = ZEXT1632(auVar162);
      auVar109 = vfnmadd213ps_fma(auVar18,auVar213,auVar270);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar18,auVar18);
      auVar259._0_4_ = auVar162._0_4_ ^ local_800;
      auVar259._4_4_ = auVar162._4_4_ ^ uStack_7fc;
      auVar259._8_4_ = auVar162._8_4_ ^ uStack_7f8;
      auVar259._12_4_ = auVar162._12_4_ ^ uStack_7f4;
      auVar259._16_4_ = fStack_7f0;
      auVar259._20_4_ = fStack_7ec;
      auVar259._24_4_ = fStack_7e8;
      auVar259._28_4_ = uStack_7e4;
      auVar264 = ZEXT3264(auVar259);
      auVar48._4_4_ = auVar109._4_4_ * (float)(auVar108._4_4_ ^ uStack_7fc);
      auVar48._0_4_ = auVar109._0_4_ * (float)(auVar108._0_4_ ^ local_800);
      auVar48._8_4_ = auVar109._8_4_ * (float)(auVar108._8_4_ ^ uStack_7f8);
      auVar48._12_4_ = auVar109._12_4_ * (float)(auVar108._12_4_ ^ uStack_7f4);
      auVar48._16_4_ = fStack_7f0 * 0.0;
      auVar48._20_4_ = fStack_7ec * 0.0;
      auVar48._24_4_ = fStack_7e8 * 0.0;
      auVar48._28_4_ = uStack_7e4;
      auVar224 = vcmpps_avx(auVar213,auVar259,1);
      auVar224 = vorps_avx(auVar224,auVar130);
      auVar129._8_4_ = 0xff800000;
      auVar129._0_8_ = 0xff800000ff800000;
      auVar129._12_4_ = 0xff800000;
      auVar129._16_4_ = 0xff800000;
      auVar129._20_4_ = 0xff800000;
      auVar129._24_4_ = 0xff800000;
      auVar129._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar48,auVar129,auVar224);
      auVar284 = ZEXT3264(auVar224);
      local_680 = vmaxps_avx(auVar155,auVar224);
      auVar224 = vcmpps_avx(auVar213,auVar259,6);
      auVar224 = vorps_avx(auVar130,auVar224);
      auVar154._8_4_ = 0x7f800000;
      auVar154._0_8_ = 0x7f8000007f800000;
      auVar154._12_4_ = 0x7f800000;
      auVar154._16_4_ = 0x7f800000;
      auVar154._20_4_ = 0x7f800000;
      auVar154._24_4_ = 0x7f800000;
      auVar154._28_4_ = 0x7f800000;
      auVar224 = vblendvps_avx(auVar48,auVar154,auVar224);
      auVar121 = vandps_avx(local_540,auVar121);
      local_320 = vminps_avx(local_940,auVar224);
      auVar224 = vcmpps_avx(local_680,local_320,2);
      auVar130 = auVar121 & auVar224;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0x7f,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar130 >> 0xbf,0) != '\0') ||
          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar130[0x1f] < '\0') {
        auVar87._4_4_ = fStack_2bc;
        auVar87._0_4_ = local_2c0;
        auVar87._8_4_ = fStack_2b8;
        auVar87._12_4_ = fStack_2b4;
        auVar87._16_4_ = uStack_2b0;
        auVar87._20_4_ = uStack_2ac;
        auVar87._24_4_ = uStack_2a8;
        auVar87._28_4_ = uStack_2a4;
        auVar130 = vminps_avx(auVar87,auVar270);
        auVar235 = ZEXT864(0) << 0x20;
        auVar130 = vmaxps_avx(auVar130,ZEXT832(0) << 0x20);
        auVar86._4_4_ = fStack_2dc;
        auVar86._0_4_ = local_2e0;
        auVar86._8_4_ = fStack_2d8;
        auVar86._12_4_ = fStack_2d4;
        auVar86._16_4_ = uStack_2d0;
        auVar86._20_4_ = uStack_2cc;
        auVar86._24_4_ = uStack_2c8;
        auVar86._28_4_ = uStack_2c4;
        auVar155 = vminps_avx(auVar86,auVar270);
        auVar155 = vmaxps_avx(auVar155,ZEXT832(0) << 0x20);
        auVar49._4_4_ = (auVar130._4_4_ + 1.0) * 0.125;
        auVar49._0_4_ = (auVar130._0_4_ + 0.0) * 0.125;
        auVar49._8_4_ = (auVar130._8_4_ + 2.0) * 0.125;
        auVar49._12_4_ = (auVar130._12_4_ + 3.0) * 0.125;
        auVar49._16_4_ = (auVar130._16_4_ + 4.0) * 0.125;
        auVar49._20_4_ = (auVar130._20_4_ + 5.0) * 0.125;
        auVar49._24_4_ = (auVar130._24_4_ + 6.0) * 0.125;
        auVar49._28_4_ = auVar130._28_4_ + 7.0;
        auVar284 = ZEXT3264(local_9c0);
        auVar109 = vfmadd213ps_fma(auVar49,local_9e0,local_9c0);
        auVar50._4_4_ = (auVar155._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar155._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar155._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar155._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar155._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar155._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar155._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar155._28_4_ + 7.0;
        auVar108 = vfmadd213ps_fma(auVar50,local_9e0,local_9c0);
        auVar130 = vminps_avx(local_7a0,auVar234);
        auVar155 = vminps_avx(auVar22,auVar23);
        auVar130 = vminps_avx(auVar130,auVar155);
        auVar15 = vsubps_avx(auVar130,auVar15);
        auVar121 = vandps_avx(auVar224,auVar121);
        local_1a0 = ZEXT1632(auVar109);
        local_1c0 = ZEXT1632(auVar108);
        auVar51._4_4_ = auVar15._4_4_ * 0.99999976;
        auVar51._0_4_ = auVar15._0_4_ * 0.99999976;
        auVar51._8_4_ = auVar15._8_4_ * 0.99999976;
        auVar51._12_4_ = auVar15._12_4_ * 0.99999976;
        auVar51._16_4_ = auVar15._16_4_ * 0.99999976;
        auVar51._20_4_ = auVar15._20_4_ * 0.99999976;
        auVar51._24_4_ = auVar15._24_4_ * 0.99999976;
        auVar51._28_4_ = auVar15._28_4_;
        auVar224 = vmaxps_avx(ZEXT832(0) << 0x20,auVar51);
        auVar52._4_4_ = auVar224._4_4_ * auVar224._4_4_;
        auVar52._0_4_ = auVar224._0_4_ * auVar224._0_4_;
        auVar52._8_4_ = auVar224._8_4_ * auVar224._8_4_;
        auVar52._12_4_ = auVar224._12_4_ * auVar224._12_4_;
        auVar52._16_4_ = auVar224._16_4_ * auVar224._16_4_;
        auVar52._20_4_ = auVar224._20_4_ * auVar224._20_4_;
        auVar52._24_4_ = auVar224._24_4_ * auVar224._24_4_;
        auVar52._28_4_ = auVar224._28_4_;
        auVar15 = vsubps_avx(auVar13,auVar52);
        auVar53._4_4_ = auVar15._4_4_ * fVar215 * 4.0;
        auVar53._0_4_ = auVar15._0_4_ * fVar249 * 4.0;
        auVar53._8_4_ = auVar15._8_4_ * fVar227 * 4.0;
        auVar53._12_4_ = auVar15._12_4_ * fVar231 * 4.0;
        auVar53._16_4_ = auVar15._16_4_ * fVar285 * 4.0;
        auVar53._20_4_ = auVar15._20_4_ * fVar216 * 4.0;
        auVar53._24_4_ = auVar15._24_4_ * fVar232 * 4.0;
        auVar53._28_4_ = auVar224._28_4_;
        auVar13 = vsubps_avx(auVar38,auVar53);
        auVar224 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
        if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar224 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar224 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar224 >> 0x7f,0) == '\0') &&
              (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar224 >> 0xbf,0) == '\0') &&
            (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar224[0x1f]) {
          auVar130 = SUB6432(ZEXT864(0),0) << 0x20;
          local_860 = ZEXT832(0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          auVar155 = ZEXT832(0) << 0x20;
          auVar245._8_4_ = 0x7f800000;
          auVar245._0_8_ = 0x7f8000007f800000;
          auVar245._12_4_ = 0x7f800000;
          auVar245._16_4_ = 0x7f800000;
          auVar245._20_4_ = 0x7f800000;
          auVar245._24_4_ = 0x7f800000;
          auVar245._28_4_ = 0x7f800000;
          auVar264 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
          _local_840 = local_860;
        }
        else {
          auVar155 = vsqrtps_avx(auVar13);
          auVar260._0_4_ = fVar249 + fVar249;
          auVar260._4_4_ = fVar215 + fVar215;
          auVar260._8_4_ = fVar227 + fVar227;
          auVar260._12_4_ = fVar231 + fVar231;
          auVar260._16_4_ = fVar285 + fVar285;
          auVar260._20_4_ = fVar216 + fVar216;
          auVar260._24_4_ = fVar232 + fVar232;
          auVar260._28_4_ = fVar202 + fVar202;
          auVar130 = vrcpps_avx(auVar260);
          auVar109 = vfnmadd213ps_fma(auVar260,auVar130,auVar270);
          auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar130,auVar130);
          auVar282._0_4_ = (uint)auVar153._0_4_ ^ local_800;
          auVar282._4_4_ = (uint)auVar153._4_4_ ^ uStack_7fc;
          auVar282._8_4_ = (uint)auVar153._8_4_ ^ uStack_7f8;
          auVar282._12_4_ = (uint)auVar153._12_4_ ^ uStack_7f4;
          auVar282._16_4_ = (uint)auVar153._16_4_ ^ (uint)fStack_7f0;
          auVar282._20_4_ = (uint)auVar153._20_4_ ^ (uint)fStack_7ec;
          auVar282._24_4_ = (uint)auVar153._24_4_ ^ (uint)fStack_7e8;
          auVar282._28_4_ = (uint)auVar153._28_4_ ^ uStack_7e4;
          auVar130 = vsubps_avx(auVar282,auVar155);
          auVar18 = vsubps_avx(auVar155,auVar153);
          fVar202 = auVar130._0_4_ * auVar109._0_4_;
          fVar237 = auVar130._4_4_ * auVar109._4_4_;
          auVar54._4_4_ = fVar237;
          auVar54._0_4_ = fVar202;
          fVar248 = auVar130._8_4_ * auVar109._8_4_;
          auVar54._8_4_ = fVar248;
          fVar249 = auVar130._12_4_ * auVar109._12_4_;
          auVar54._12_4_ = fVar249;
          fVar251 = auVar130._16_4_ * 0.0;
          auVar54._16_4_ = fVar251;
          fVar215 = auVar130._20_4_ * 0.0;
          auVar54._20_4_ = fVar215;
          fVar226 = auVar130._24_4_ * 0.0;
          auVar54._24_4_ = fVar226;
          auVar54._28_4_ = auVar155._28_4_;
          fVar227 = auVar18._0_4_ * auVar109._0_4_;
          fVar228 = auVar18._4_4_ * auVar109._4_4_;
          auVar55._4_4_ = fVar228;
          auVar55._0_4_ = fVar227;
          fVar229 = auVar18._8_4_ * auVar109._8_4_;
          auVar55._8_4_ = fVar229;
          fVar230 = auVar18._12_4_ * auVar109._12_4_;
          auVar55._12_4_ = fVar230;
          fVar231 = auVar18._16_4_ * 0.0;
          auVar55._16_4_ = fVar231;
          fVar285 = auVar18._20_4_ * 0.0;
          auVar55._20_4_ = fVar285;
          fVar216 = auVar18._24_4_ * 0.0;
          auVar55._24_4_ = fVar216;
          auVar55._28_4_ = auVar130._28_4_;
          auVar284 = ZEXT3264(auVar55);
          auVar109 = vfmadd213ps_fma(auVar278,auVar54,auVar298);
          auVar108 = vfmadd213ps_fma(auVar278,auVar55,auVar298);
          auVar130 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar217,
                                        CONCAT48(auVar109._8_4_ * fVar250,
                                                 CONCAT44(auVar109._4_4_ * fVar247,
                                                          auVar109._0_4_ * fVar105))));
          auVar56._28_4_ = 0x3f800000;
          auVar56._0_28_ =
               ZEXT1628(CONCAT412(auVar108._12_4_ * fVar217,
                                  CONCAT48(auVar108._8_4_ * fVar250,
                                           CONCAT44(auVar108._4_4_ * fVar247,
                                                    auVar108._0_4_ * fVar105))));
          auVar109 = vfmadd213ps_fma(auVar16,auVar130,auVar152);
          auVar108 = vfmadd213ps_fma(auVar16,auVar56,auVar152);
          auVar162 = vfmadd213ps_fma(local_240,auVar130,auVar122);
          auVar140 = vfmadd213ps_fma(local_240,auVar56,auVar122);
          auVar107 = vfmadd213ps_fma(auVar130,auVar17,auVar180);
          auVar141 = vfmadd213ps_fma(auVar17,auVar56,auVar180);
          auVar57._4_4_ = (float)local_7e0._4_4_ * fVar237;
          auVar57._0_4_ = (float)local_7e0._0_4_ * fVar202;
          auVar57._8_4_ = fStack_7d8 * fVar248;
          auVar57._12_4_ = fStack_7d4 * fVar249;
          auVar57._16_4_ = fStack_7d0 * fVar251;
          auVar57._20_4_ = fStack_7cc * fVar215;
          auVar57._24_4_ = fStack_7c8 * fVar226;
          auVar57._28_4_ = 0;
          auVar130 = vsubps_avx(auVar57,ZEXT1632(auVar109));
          auVar61._4_4_ = (float)local_a20._4_4_ * fVar237;
          auVar61._0_4_ = (float)local_a20._0_4_ * fVar202;
          auVar61._8_4_ = fStack_a18 * fVar248;
          auVar61._12_4_ = fStack_a14 * fVar249;
          auVar61._16_4_ = fStack_a10 * fVar251;
          auVar61._20_4_ = fStack_a0c * fVar215;
          auVar61._24_4_ = fStack_a08 * fVar226;
          auVar61._28_4_ = 0x3f800000;
          auVar155 = vsubps_avx(auVar61,ZEXT1632(auVar162));
          auVar181._0_4_ = (float)local_980._0_4_ * fVar202;
          auVar181._4_4_ = (float)local_980._4_4_ * fVar237;
          auVar181._8_4_ = fStack_978 * fVar248;
          auVar181._12_4_ = fStack_974 * fVar249;
          auVar181._16_4_ = fStack_970 * fVar251;
          auVar181._20_4_ = fStack_96c * fVar215;
          auVar181._24_4_ = fStack_968 * fVar226;
          auVar181._28_4_ = 0;
          auVar16 = vsubps_avx(auVar181,ZEXT1632(auVar107));
          auVar235 = ZEXT3264(auVar16);
          auVar261._0_4_ = (float)local_7e0._0_4_ * fVar227;
          auVar261._4_4_ = (float)local_7e0._4_4_ * fVar228;
          auVar261._8_4_ = fStack_7d8 * fVar229;
          auVar261._12_4_ = fStack_7d4 * fVar230;
          auVar261._16_4_ = fStack_7d0 * fVar231;
          auVar261._20_4_ = fStack_7cc * fVar285;
          auVar261._24_4_ = fStack_7c8 * fVar216;
          auVar261._28_4_ = 0;
          _local_840 = vsubps_avx(auVar261,ZEXT1632(auVar108));
          auVar58._4_4_ = (float)local_a20._4_4_ * fVar228;
          auVar58._0_4_ = (float)local_a20._0_4_ * fVar227;
          auVar58._8_4_ = fStack_a18 * fVar229;
          auVar58._12_4_ = fStack_a14 * fVar230;
          auVar58._16_4_ = fStack_a10 * fVar231;
          auVar58._20_4_ = fStack_a0c * fVar285;
          auVar58._24_4_ = fStack_a08 * fVar216;
          auVar58._28_4_ = local_840._28_4_;
          local_860 = vsubps_avx(auVar58,ZEXT1632(auVar140));
          auVar59._4_4_ = (float)local_980._4_4_ * fVar228;
          auVar59._0_4_ = (float)local_980._0_4_ * fVar227;
          auVar59._8_4_ = fStack_978 * fVar229;
          auVar59._12_4_ = fStack_974 * fVar230;
          auVar59._16_4_ = fStack_970 * fVar231;
          auVar59._20_4_ = fStack_96c * fVar285;
          auVar59._24_4_ = fStack_968 * fVar216;
          auVar59._28_4_ = local_860._28_4_;
          _local_880 = vsubps_avx(auVar59,ZEXT1632(auVar141));
          auVar279 = ZEXT864(0) << 0x20;
          auVar16 = vcmpps_avx(auVar13,_DAT_01faff00,5);
          auVar262._8_4_ = 0x7f800000;
          auVar262._0_8_ = 0x7f8000007f800000;
          auVar262._12_4_ = 0x7f800000;
          auVar262._16_4_ = 0x7f800000;
          auVar262._20_4_ = 0x7f800000;
          auVar262._24_4_ = 0x7f800000;
          auVar262._28_4_ = 0x7f800000;
          auVar245 = vblendvps_avx(auVar262,auVar54,auVar16);
          auVar64._4_4_ = uStack_81c;
          auVar64._0_4_ = local_820;
          auVar64._8_4_ = uStack_818;
          auVar64._12_4_ = uStack_814;
          auVar64._16_4_ = uStack_810;
          auVar64._20_4_ = uStack_80c;
          auVar64._24_4_ = uStack_808;
          auVar64._28_4_ = uStack_804;
          auVar13 = vandps_avx(auVar64,local_260);
          auVar13 = vmaxps_avx(local_560,auVar13);
          auVar289 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar60._4_4_ = auVar13._4_4_ * 1.9073486e-06;
          auVar60._0_4_ = auVar13._0_4_ * 1.9073486e-06;
          auVar60._8_4_ = auVar13._8_4_ * 1.9073486e-06;
          auVar60._12_4_ = auVar13._12_4_ * 1.9073486e-06;
          auVar60._16_4_ = auVar13._16_4_ * 1.9073486e-06;
          auVar60._20_4_ = auVar13._20_4_ * 1.9073486e-06;
          auVar60._24_4_ = auVar13._24_4_ * 1.9073486e-06;
          auVar60._28_4_ = auVar13._28_4_;
          auVar13 = vandps_avx(auVar64,local_960);
          auVar17 = vcmpps_avx(auVar13,auVar60,1);
          auVar263._8_4_ = 0xff800000;
          auVar263._0_8_ = 0xff800000ff800000;
          auVar263._12_4_ = 0xff800000;
          auVar263._16_4_ = 0xff800000;
          auVar263._20_4_ = 0xff800000;
          auVar263._24_4_ = 0xff800000;
          auVar263._28_4_ = 0xff800000;
          auVar13 = vblendvps_avx(auVar263,auVar55,auVar16);
          auVar264 = ZEXT3264(auVar13);
          auVar18 = auVar16 & auVar17;
          if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar18 >> 0x7f,0) != '\0') ||
                (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar18 >> 0xbf,0) != '\0') ||
              (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar18[0x1f] < '\0') {
            auVar224 = vandps_avx(auVar17,auVar16);
            auVar17 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,2);
            auVar283._8_4_ = 0xff800000;
            auVar283._0_8_ = 0xff800000ff800000;
            auVar283._12_4_ = 0xff800000;
            auVar283._16_4_ = 0xff800000;
            auVar283._20_4_ = 0xff800000;
            auVar283._24_4_ = 0xff800000;
            auVar283._28_4_ = 0xff800000;
            auVar284 = ZEXT3264(auVar283);
            auVar288._8_4_ = 0x7f800000;
            auVar288._0_8_ = 0x7f8000007f800000;
            auVar288._12_4_ = 0x7f800000;
            auVar288._16_4_ = 0x7f800000;
            auVar288._20_4_ = 0x7f800000;
            auVar288._24_4_ = 0x7f800000;
            auVar288._28_4_ = 0x7f800000;
            auVar289 = ZEXT3264(auVar288);
            auVar15 = vblendvps_avx(auVar288,auVar283,auVar17);
            auVar109 = vpackssdw_avx(auVar224._0_16_,auVar224._16_16_);
            auVar18 = vpmovsxwd_avx2(auVar109);
            auVar245 = vblendvps_avx(auVar245,auVar15,auVar18);
            auVar15 = vblendvps_avx(auVar283,auVar288,auVar17);
            auVar279 = ZEXT3264(auVar15);
            auVar15 = vblendvps_avx(auVar13,auVar15,auVar18);
            auVar264 = ZEXT3264(auVar15);
            auVar225._0_8_ = auVar224._0_8_ ^ 0xffffffffffffffff;
            auVar225._8_4_ = auVar224._8_4_ ^ 0xffffffff;
            auVar225._12_4_ = auVar224._12_4_ ^ 0xffffffff;
            auVar225._16_4_ = auVar224._16_4_ ^ 0xffffffff;
            auVar225._20_4_ = auVar224._20_4_ ^ 0xffffffff;
            auVar225._24_4_ = auVar224._24_4_ ^ 0xffffffff;
            auVar225._28_4_ = auVar224._28_4_ ^ 0xffffffff;
            auVar224 = vorps_avx(auVar17,auVar225);
            auVar224 = vandps_avx(auVar16,auVar224);
          }
        }
        auVar271 = ZEXT3264(local_680);
        local_380 = local_680;
        local_360 = vminps_avx(local_320,auVar245);
        _local_6a0 = vmaxps_avx(local_680,auVar264._0_32_);
        auVar246 = ZEXT3264(_local_6a0);
        local_340 = _local_6a0;
        auVar15 = vcmpps_avx(local_680,local_360,2);
        local_5e0 = vandps_avx(auVar15,auVar121);
        auVar15 = vcmpps_avx(_local_6a0,local_320,2);
        local_620 = vandps_avx(auVar15,auVar121);
        auVar121 = vorps_avx(local_620,local_5e0);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_640._0_8_ = auVar224._0_8_ ^ 0xffffffffffffffff;
          local_640._8_4_ = auVar224._8_4_ ^ 0xffffffff;
          local_640._12_4_ = auVar224._12_4_ ^ 0xffffffff;
          local_640._16_4_ = auVar224._16_4_ ^ 0xffffffff;
          local_640._20_4_ = auVar224._20_4_ ^ 0xffffffff;
          local_640._24_4_ = auVar224._24_4_ ^ 0xffffffff;
          local_640._28_4_ = auVar224._28_4_ ^ 0xffffffff;
          auVar246 = ZEXT3264(local_640);
          auVar187._0_4_ = (float)local_980._0_4_ * auVar235._0_4_;
          auVar187._4_4_ = (float)local_980._4_4_ * auVar235._4_4_;
          auVar187._8_4_ = fStack_978 * auVar235._8_4_;
          auVar187._12_4_ = fStack_974 * auVar235._12_4_;
          auVar187._16_4_ = fStack_970 * auVar235._16_4_;
          auVar187._20_4_ = fStack_96c * auVar235._20_4_;
          auVar187._28_36_ = auVar235._28_36_;
          auVar187._24_4_ = fStack_968 * auVar235._24_4_;
          auVar109 = vfmadd213ps_fma(auVar155,_local_a20,auVar187._0_32_);
          auVar109 = vfmadd213ps_fma(auVar130,_local_7e0,ZEXT1632(auVar109));
          auVar65._4_4_ = uStack_81c;
          auVar65._0_4_ = local_820;
          auVar65._8_4_ = uStack_818;
          auVar65._12_4_ = uStack_814;
          auVar65._16_4_ = uStack_810;
          auVar65._20_4_ = uStack_80c;
          auVar65._24_4_ = uStack_808;
          auVar65._28_4_ = uStack_804;
          auVar121 = vandps_avx(ZEXT1632(auVar109),auVar65);
          auVar158._8_4_ = 0x3e99999a;
          auVar158._0_8_ = 0x3e99999a3e99999a;
          auVar158._12_4_ = 0x3e99999a;
          auVar158._16_4_ = 0x3e99999a;
          auVar158._20_4_ = 0x3e99999a;
          auVar158._24_4_ = 0x3e99999a;
          auVar158._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar158,1);
          auVar121 = vorps_avx(auVar121,local_640);
          auVar159._8_4_ = 3;
          auVar159._0_8_ = 0x300000003;
          auVar159._12_4_ = 3;
          auVar159._16_4_ = 3;
          auVar159._20_4_ = 3;
          auVar159._24_4_ = 3;
          auVar159._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar182,auVar159,auVar121);
          local_660._4_4_ = local_c08;
          local_660._0_4_ = local_c08;
          local_660._8_4_ = local_c08;
          local_660._12_4_ = local_c08;
          local_660._16_4_ = local_c08;
          local_660._20_4_ = local_c08;
          local_660._24_4_ = local_c08;
          local_660._28_4_ = local_c08;
          local_600 = vpcmpgtd_avx2(auVar121,local_660);
          local_5c0 = vpandn_avx2(local_600,local_5e0);
          auVar235 = ZEXT3264(local_5c0);
          auVar121 = local_5e0 & ~local_600;
          fStack_adc = auVar8._4_4_;
          fStack_ad8 = auVar8._8_4_;
          fStack_ad4 = auVar8._12_4_;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0x7f,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0xbf,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar121[0x1f]) {
            auVar134._4_4_ = fVar293;
            auVar134._0_4_ = fVar293;
            auVar134._8_4_ = fVar293;
            auVar134._12_4_ = fVar293;
            auVar134._16_4_ = fVar293;
            auVar134._20_4_ = fVar293;
            auVar134._24_4_ = fVar293;
            auVar134._28_4_ = fVar293;
            fVar105 = (float)local_980._0_4_;
            fVar237 = (float)local_980._4_4_;
            fVar247 = fStack_978;
            fVar249 = fStack_974;
            fVar250 = fStack_970;
            fVar251 = fStack_96c;
            fVar215 = fStack_968;
          }
          else {
            auVar108 = vminps_avx(auVar9,auVar11);
            auVar109 = vmaxps_avx(auVar9,auVar11);
            auVar162 = vminps_avx(auVar10,auVar8);
            auVar140 = vminps_avx(auVar108,auVar162);
            auVar108 = vmaxps_avx(auVar10,auVar8);
            auVar162 = vmaxps_avx(auVar109,auVar108);
            auVar109 = vandps_avx(auVar140,auVar238);
            auVar108 = vandps_avx(auVar162,auVar238);
            auVar109 = vmaxps_avx(auVar109,auVar108);
            auVar108 = vmovshdup_avx(auVar109);
            auVar108 = vmaxss_avx(auVar108,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar108);
            local_900._0_4_ = auVar109._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar162,auVar162,0xff);
            local_b80._4_4_ = local_680._4_4_ + (float)local_a00._4_4_;
            local_b80._0_4_ = local_680._0_4_ + (float)local_a00._0_4_;
            fStack_b78 = local_680._8_4_ + fStack_9f8;
            fStack_b74 = local_680._12_4_ + fStack_9f4;
            fStack_b70 = local_680._16_4_ + fStack_9f0;
            fStack_b6c = local_680._20_4_ + fStack_9ec;
            fStack_b68 = local_680._24_4_ + fStack_9e8;
            fStack_b64 = local_680._28_4_ + fStack_9e4;
            do {
              auVar135._8_4_ = 0x7f800000;
              auVar135._0_8_ = 0x7f8000007f800000;
              auVar135._12_4_ = 0x7f800000;
              auVar135._16_4_ = 0x7f800000;
              auVar135._20_4_ = 0x7f800000;
              auVar135._24_4_ = 0x7f800000;
              auVar135._28_4_ = 0x7f800000;
              auVar121 = auVar235._0_32_;
              auVar224 = vblendvps_avx(auVar135,local_680,auVar121);
              auVar15 = vshufps_avx(auVar224,auVar224,0xb1);
              auVar15 = vminps_avx(auVar224,auVar15);
              auVar13 = vshufpd_avx(auVar15,auVar15,5);
              auVar15 = vminps_avx(auVar15,auVar13);
              auVar13 = vpermpd_avx2(auVar15,0x4e);
              auVar15 = vminps_avx(auVar15,auVar13);
              auVar224 = vcmpps_avx(auVar224,auVar15,0);
              auVar15 = auVar121 & auVar224;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar224,auVar121);
              }
              uVar94 = vmovmskps_avx(auVar121);
              iVar24 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar95 = iVar24 << 2;
              *(undefined4 *)(local_5c0 + uVar95) = 0;
              uVar94 = *(uint *)(local_1a0 + uVar95);
              uVar95 = *(uint *)(local_380 + uVar95);
              fVar202 = auVar5._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar202 = sqrtf((float)local_9a0._0_4_);
              }
              local_780._0_4_ = fVar202 * 1.9073486e-06;
              auVar109 = vinsertps_avx(ZEXT416(uVar95),ZEXT416(uVar94),0x10);
              auVar271 = ZEXT1664(auVar109);
              bVar101 = true;
              uVar96 = 0;
              do {
                fVar249 = auVar271._0_4_;
                auVar111._4_4_ = fVar249;
                auVar111._0_4_ = fVar249;
                auVar111._8_4_ = fVar249;
                auVar111._12_4_ = fVar249;
                auVar162 = vfmadd213ps_fma(auVar111,local_990,_DAT_01f7aa10);
                auVar108 = vmovshdup_avx(auVar271._0_16_);
                fVar250 = auVar108._0_4_;
                fVar248 = 1.0 - fVar250;
                auVar289 = ZEXT464((uint)fVar248);
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar141 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar140 = vfmadd213ss_fma(auVar116,auVar108,auVar141);
                auVar109 = vfmadd213ss_fma(auVar140,ZEXT416((uint)(fVar250 * fVar250)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar107 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar248),auVar141);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)(fVar248 * fVar248)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar202 = fVar248 * fVar248 * -fVar250 * 0.5;
                fVar105 = auVar109._0_4_ * 0.5;
                fVar237 = auVar107._0_4_ * 0.5;
                fVar247 = fVar250 * fVar250 * -fVar248 * 0.5;
                auVar188._0_4_ = fVar247 * fVar138;
                auVar188._4_4_ = fVar247 * fStack_adc;
                auVar188._8_4_ = fVar247 * fStack_ad8;
                auVar188._12_4_ = fVar247 * fStack_ad4;
                auVar205._4_4_ = fVar237;
                auVar205._0_4_ = fVar237;
                auVar205._8_4_ = fVar237;
                auVar205._12_4_ = fVar237;
                auVar109 = vfmadd132ps_fma(auVar205,auVar188,auVar10);
                auVar163._4_4_ = fVar105;
                auVar163._0_4_ = fVar105;
                auVar163._8_4_ = fVar105;
                auVar163._12_4_ = fVar105;
                auVar109 = vfmadd132ps_fma(auVar163,auVar109,auVar11);
                auVar189._4_4_ = fVar202;
                auVar189._0_4_ = fVar202;
                auVar189._8_4_ = fVar202;
                auVar189._12_4_ = fVar202;
                auVar109 = vfmadd132ps_fma(auVar189,auVar109,auVar9);
                auVar141 = vfmadd231ss_fma(auVar141,auVar108,ZEXT416(0x41100000));
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar108,
                                           ZEXT416(0x40800000));
                local_940._0_16_ = auVar109;
                auVar109 = vsubps_avx(auVar162,auVar109);
                _local_920 = auVar109;
                auVar109 = vdpps_avx(auVar109,auVar109,0x7f);
                auVar162 = vfmadd213ss_fma(auVar116,auVar108,ZEXT416(0xbf800000));
                fVar202 = auVar109._0_4_;
                if (fVar202 < 0.0) {
                  local_9c0._0_16_ = auVar141;
                  local_9e0._0_4_ = fVar248 * -2.0;
                  auVar264._0_4_ = sqrtf(fVar202);
                  auVar264._4_60_ = extraout_var;
                  auVar289 = ZEXT1664(ZEXT416((uint)fVar248));
                  auVar140 = ZEXT416(auVar140._0_4_);
                  auVar116 = auVar264._0_16_;
                  fVar105 = (float)local_9e0._0_4_;
                  auVar141 = local_9c0._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar109,auVar109);
                  fVar105 = fVar248 * -2.0;
                }
                fVar237 = auVar289._0_4_;
                auVar204 = vfmadd213ss_fma(auVar140,ZEXT416((uint)(fVar250 + fVar250)),
                                           ZEXT416((uint)(fVar250 * fVar250 * 3.0)));
                auVar203 = SUB6416(ZEXT464(0x40000000),0);
                auVar140 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,auVar203);
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar237 * -3.0)),
                                           ZEXT416((uint)(fVar237 + fVar237)),auVar140);
                auVar218 = auVar289._0_16_;
                auVar139 = vfnmadd231ss_fma(ZEXT416((uint)(fVar250 * (fVar237 + fVar237))),auVar218,
                                            auVar218);
                auVar140 = vfmadd213ss_fma(ZEXT416((uint)fVar105),auVar108,
                                           ZEXT416((uint)(fVar250 * fVar250)));
                fVar105 = auVar106._0_4_ * 0.5;
                fVar237 = auVar140._0_4_ * 0.5;
                auVar164._0_4_ = fVar138 * fVar237;
                auVar164._4_4_ = fStack_adc * fVar237;
                auVar164._8_4_ = fStack_ad8 * fVar237;
                auVar164._12_4_ = fStack_ad4 * fVar237;
                auVar142._4_4_ = fVar105;
                auVar142._0_4_ = fVar105;
                auVar142._8_4_ = fVar105;
                auVar142._12_4_ = fVar105;
                auVar140 = vfmadd213ps_fma(auVar142,auVar10,auVar164);
                fVar105 = auVar139._0_4_ * 0.5;
                fVar237 = auVar204._0_4_ * 0.5;
                auVar165._4_4_ = fVar237;
                auVar165._0_4_ = fVar237;
                auVar165._8_4_ = fVar237;
                auVar165._12_4_ = fVar237;
                auVar140 = vfmadd213ps_fma(auVar165,auVar11,auVar140);
                auVar274._4_4_ = fVar105;
                auVar274._0_4_ = fVar105;
                auVar274._8_4_ = fVar105;
                auVar274._12_4_ = fVar105;
                auVar204 = vfmadd213ps_fma(auVar274,auVar9,auVar140);
                auVar140 = vfmadd213ss_fma(auVar108,SUB6416(ZEXT464(0xc0400000),0),auVar203);
                local_b20 = auVar162._0_4_;
                auVar112._0_4_ = fVar138 * local_b20;
                auVar112._4_4_ = fStack_adc * local_b20;
                auVar112._8_4_ = fStack_ad8 * local_b20;
                auVar112._12_4_ = fStack_ad4 * local_b20;
                local_aa0 = auVar107._0_4_;
                auVar143._4_4_ = local_aa0;
                auVar143._0_4_ = local_aa0;
                auVar143._8_4_ = local_aa0;
                auVar143._12_4_ = local_aa0;
                auVar108 = vfmadd213ps_fma(auVar143,auVar10,auVar112);
                uVar104 = auVar141._0_4_;
                auVar166._4_4_ = uVar104;
                auVar166._0_4_ = uVar104;
                auVar166._8_4_ = uVar104;
                auVar166._12_4_ = uVar104;
                auVar108 = vfmadd213ps_fma(auVar166,auVar11,auVar108);
                auVar162 = vdpps_avx(auVar204,auVar204,0x7f);
                uVar104 = auVar140._0_4_;
                auVar144._4_4_ = uVar104;
                auVar144._0_4_ = uVar104;
                auVar144._8_4_ = uVar104;
                auVar144._12_4_ = uVar104;
                auVar107 = vfmadd213ps_fma(auVar144,auVar9,auVar108);
                auVar108 = vblendps_avx(auVar162,_DAT_01f7aa10,0xe);
                auVar140 = vrsqrtss_avx(auVar108,auVar108);
                fVar247 = auVar162._0_4_;
                fVar105 = auVar140._0_4_;
                auVar140 = vdpps_avx(auVar204,auVar107,0x7f);
                fVar105 = fVar105 * 1.5 + fVar247 * -0.5 * fVar105 * fVar105 * fVar105;
                auVar145._0_4_ = auVar107._0_4_ * fVar247;
                auVar145._4_4_ = auVar107._4_4_ * fVar247;
                auVar145._8_4_ = auVar107._8_4_ * fVar247;
                auVar145._12_4_ = auVar107._12_4_ * fVar247;
                fVar237 = auVar140._0_4_;
                auVar222._0_4_ = auVar204._0_4_ * fVar237;
                auVar222._4_4_ = auVar204._4_4_ * fVar237;
                fVar248 = auVar204._8_4_;
                auVar222._8_4_ = fVar248 * fVar237;
                fVar250 = auVar204._12_4_;
                auVar222._12_4_ = fVar250 * fVar237;
                auVar140 = vsubps_avx(auVar145,auVar222);
                auVar108 = vrcpss_avx(auVar108,auVar108);
                auVar107 = vfnmadd213ss_fma(auVar108,auVar162,auVar203);
                fVar237 = auVar108._0_4_ * auVar107._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)local_900._0_4_),
                                      ZEXT416((uint)(fVar249 * (float)local_780._0_4_)));
                auVar284 = ZEXT1664(auVar108);
                auVar240._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
                auVar240._8_4_ = -fVar248;
                auVar240._12_4_ = -fVar250;
                auVar190._0_4_ = fVar105 * auVar140._0_4_ * fVar237;
                auVar190._4_4_ = fVar105 * auVar140._4_4_ * fVar237;
                auVar190._8_4_ = fVar105 * auVar140._8_4_ * fVar237;
                auVar190._12_4_ = fVar105 * auVar140._12_4_ * fVar237;
                auVar255._0_4_ = auVar204._0_4_ * fVar105;
                auVar255._4_4_ = auVar204._4_4_ * fVar105;
                auVar255._8_4_ = fVar248 * fVar105;
                auVar255._12_4_ = fVar250 * fVar105;
                if (fVar247 < -fVar247) {
                  auVar289 = ZEXT1664(auVar218);
                  fVar105 = sqrtf(fVar247);
                  auVar284 = ZEXT464(auVar108._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                }
                else {
                  auVar162 = vsqrtss_avx(auVar162,auVar162);
                  fVar105 = auVar162._0_4_;
                }
                auVar264 = ZEXT1664(auVar255);
                auVar162 = vdpps_avx(_local_920,auVar255,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)local_900._0_4_),auVar116,auVar284._0_16_);
                auVar140 = vdpps_avx(auVar240,auVar255,0x7f);
                auVar107 = vdpps_avx(_local_920,auVar190,0x7f);
                auVar141 = vdpps_avx(local_990,auVar255,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_900._0_4_ / fVar105)),
                                           auVar106);
                auVar279 = ZEXT1664(auVar106);
                fVar105 = auVar140._0_4_ + auVar107._0_4_;
                fVar247 = auVar162._0_4_;
                auVar113._0_4_ = fVar247 * fVar247;
                auVar113._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar113._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar113._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar140 = vdpps_avx(_local_920,auVar240,0x7f);
                auVar116 = vsubps_avx(auVar109,auVar113);
                auVar107 = vrsqrtss_avx(auVar116,auVar116);
                fVar248 = auVar116._0_4_;
                fVar237 = auVar107._0_4_;
                fVar237 = fVar237 * 1.5 + fVar248 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar107 = vdpps_avx(_local_920,local_990,0x7f);
                auVar140 = vfnmadd231ss_fma(auVar140,auVar162,ZEXT416((uint)fVar105));
                auVar107 = vfnmadd231ss_fma(auVar107,auVar162,auVar141);
                if (fVar248 < 0.0) {
                  local_9c0._0_16_ = auVar141;
                  local_9e0._0_4_ = fVar237;
                  local_7a0._0_16_ = auVar107;
                  auVar264 = ZEXT1664(auVar255);
                  auVar289 = ZEXT1664(auVar289._0_16_);
                  fVar248 = sqrtf(fVar248);
                  auVar279 = ZEXT464(auVar106._0_4_);
                  auVar284 = ZEXT464(auVar108._0_4_);
                  fVar237 = (float)local_9e0._0_4_;
                  auVar107 = local_7a0._0_16_;
                  auVar141 = local_9c0._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar116,auVar116);
                  fVar248 = auVar108._0_4_;
                }
                auVar246 = ZEXT1664(auVar204);
                auVar108 = vpermilps_avx(local_940._0_16_,0xff);
                fVar248 = fVar248 - auVar108._0_4_;
                auVar116 = vshufps_avx(auVar204,auVar204,0xff);
                auVar108 = vfmsub213ss_fma(auVar140,ZEXT416((uint)fVar237),auVar116);
                auVar191._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar141._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar141._12_4_ ^ 0x80000000;
                auVar206._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar108._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar108._12_4_ ^ 0x80000000;
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * fVar237));
                auVar140 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * auVar108._0_4_)),
                                           ZEXT416((uint)fVar105),auVar107);
                auVar108 = vinsertps_avx(auVar206,auVar107,0x1c);
                uVar104 = auVar140._0_4_;
                auVar207._4_4_ = uVar104;
                auVar207._0_4_ = uVar104;
                auVar207._8_4_ = uVar104;
                auVar207._12_4_ = uVar104;
                auVar108 = vdivps_avx(auVar108,auVar207);
                auVar140 = vinsertps_avx(ZEXT416((uint)fVar105),auVar191,0x10);
                auVar140 = vdivps_avx(auVar140,auVar207);
                auVar167._0_4_ = fVar247 * auVar108._0_4_ + fVar248 * auVar140._0_4_;
                auVar167._4_4_ = fVar247 * auVar108._4_4_ + fVar248 * auVar140._4_4_;
                auVar167._8_4_ = fVar247 * auVar108._8_4_ + fVar248 * auVar140._8_4_;
                auVar167._12_4_ = fVar247 * auVar108._12_4_ + fVar248 * auVar140._12_4_;
                auVar140 = vsubps_avx(auVar271._0_16_,auVar167);
                auVar271 = ZEXT1664(auVar140);
                auVar108 = vandps_avx(auVar162,auVar238);
                fVar105 = (float)local_980._0_4_;
                fVar237 = (float)local_980._4_4_;
                fVar247 = fStack_978;
                fVar249 = fStack_974;
                fVar250 = fStack_970;
                fVar251 = fStack_96c;
                fVar215 = fStack_968;
                if (auVar108._0_4_ < auVar279._0_4_) {
                  auVar162 = vfmadd231ss_fma(ZEXT416((uint)(auVar284._0_4_ + auVar279._0_4_)),
                                             local_7c0,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(ZEXT416((uint)fVar248),auVar238);
                  if (auVar108._0_4_ < auVar162._0_4_) {
                    fVar248 = auVar140._0_4_ + (float)local_8b0._0_4_;
                    if (fVar248 < fVar103) {
                      bVar102 = 0;
                    }
                    else {
                      fVar217 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar217 < fVar248) {
                        bVar102 = 0;
                      }
                      else {
                        auVar108 = vmovshdup_avx(auVar140);
                        bVar102 = 0;
                        if ((0.0 <= auVar108._0_4_) && (auVar108._0_4_ <= 1.0)) {
                          auVar109 = vrsqrtss_avx(auVar109,auVar109);
                          fVar226 = auVar109._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar102 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar102 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                  ) {
                            fVar202 = fVar226 * 1.5 + fVar202 * -0.5 * fVar226 * fVar226 * fVar226;
                            auVar168._0_4_ = fVar202 * (float)local_920._0_4_;
                            auVar168._4_4_ = fVar202 * (float)local_920._4_4_;
                            auVar168._8_4_ = fVar202 * fStack_918;
                            auVar168._12_4_ = fVar202 * fStack_914;
                            auVar107 = vfmadd213ps_fma(auVar116,auVar168,auVar204);
                            auVar109 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar108 = vshufps_avx(auVar204,auVar204,0xc9);
                            auVar169._0_4_ = auVar168._0_4_ * auVar108._0_4_;
                            auVar169._4_4_ = auVar168._4_4_ * auVar108._4_4_;
                            auVar169._8_4_ = auVar168._8_4_ * auVar108._8_4_;
                            auVar169._12_4_ = auVar168._12_4_ * auVar108._12_4_;
                            auVar162 = vfmsub231ps_fma(auVar169,auVar204,auVar109);
                            auVar109 = vshufps_avx(auVar162,auVar162,0xc9);
                            auVar108 = vshufps_avx(auVar107,auVar107,0xc9);
                            auVar162 = vshufps_avx(auVar162,auVar162,0xd2);
                            auVar114._0_4_ = auVar107._0_4_ * auVar162._0_4_;
                            auVar114._4_4_ = auVar107._4_4_ * auVar162._4_4_;
                            auVar114._8_4_ = auVar107._8_4_ * auVar162._8_4_;
                            auVar114._12_4_ = auVar107._12_4_ * auVar162._12_4_;
                            auVar109 = vfmsub231ps_fma(auVar114,auVar109,auVar108);
                            local_710 = vshufps_avx(auVar140,auVar140,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar109,auVar109,0x55);
                            auStack_730 = vshufps_avx(auVar109,auVar109,0xaa);
                            local_720 = auVar109._0_4_;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar248;
                            auVar109 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_8e0._0_16_ = auVar109;
                            local_a50.valid = (int *)local_8e0;
                            local_a50.geometryUserPtr = pGVar3->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_740;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            uStack_71c = local_720;
                            uStack_718 = local_720;
                            uStack_714 = local_720;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar246 = ZEXT1664(auVar204);
                              auVar264 = ZEXT1664(auVar264._0_16_);
                              auVar271 = ZEXT1664(auVar140);
                              auVar279 = ZEXT1664(auVar279._0_16_);
                              auVar284 = ZEXT1664(auVar284._0_16_);
                              auVar289 = ZEXT1664(auVar289._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_a50);
                              auVar109 = local_8e0._0_16_;
                              fVar105 = (float)local_980._0_4_;
                              fVar237 = (float)local_980._4_4_;
                              fVar247 = fStack_978;
                              fVar249 = fStack_974;
                              fVar250 = fStack_970;
                              fVar251 = fStack_96c;
                              fVar215 = fStack_968;
                            }
                            if (auVar109 == (undefined1  [16])0x0) {
                              auVar109 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar109 = auVar109 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar246 = ZEXT1664(auVar246._0_16_);
                                auVar264 = ZEXT1664(auVar264._0_16_);
                                auVar271 = ZEXT1664(auVar271._0_16_);
                                auVar279 = ZEXT1664(auVar279._0_16_);
                                auVar284 = ZEXT1664(auVar284._0_16_);
                                auVar289 = ZEXT1664(auVar289._0_16_);
                                (*p_Var4)(&local_a50);
                                auVar109 = local_8e0._0_16_;
                                fVar105 = (float)local_980._0_4_;
                                fVar237 = (float)local_980._4_4_;
                                fVar247 = fStack_978;
                                fVar249 = fStack_974;
                                fVar250 = fStack_970;
                                fVar251 = fStack_96c;
                                fVar215 = fStack_968;
                              }
                              auVar108 = vpcmpeqd_avx(auVar109,_DAT_01f7aa10);
                              auVar109 = auVar108 ^ _DAT_01f7ae20;
                              auVar170._8_4_ = 0xff800000;
                              auVar170._0_8_ = 0xff800000ff800000;
                              auVar170._12_4_ = 0xff800000;
                              auVar108 = vblendvps_avx(auVar170,*(undefined1 (*) [16])
                                                                 (local_a50.ray + 0x80),auVar108);
                              *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar108;
                            }
                            auVar146._8_8_ = 0x100000001;
                            auVar146._0_8_ = 0x100000001;
                            bVar102 = (auVar146 & auVar109) != (undefined1  [16])0x0;
                            if (!(bool)bVar102) {
                              *(float *)(ray + k * 4 + 0x80) = fVar217;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0160c576;
                  }
                }
                bVar101 = uVar96 < 4;
                uVar96 = uVar96 + 1;
              } while (uVar96 != 5);
              bVar101 = false;
              bVar102 = 5;
LAB_0160c576:
              bVar100 = (bool)(bVar100 | bVar101 & bVar102);
              uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar134._4_4_ = uVar104;
              auVar134._0_4_ = uVar104;
              auVar134._8_4_ = uVar104;
              auVar134._12_4_ = uVar104;
              auVar134._16_4_ = uVar104;
              auVar134._20_4_ = uVar104;
              auVar134._24_4_ = uVar104;
              auVar134._28_4_ = uVar104;
              auVar224 = vcmpps_avx(_local_b80,auVar134,2);
              auVar121 = vandps_avx(auVar224,local_5c0);
              auVar235 = ZEXT3264(auVar121);
              auVar224 = local_5c0 & auVar224;
              local_5c0 = auVar121;
            } while ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar224 >> 0x7f,0) != '\0') ||
                       (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar224 >> 0xbf,0) != '\0') ||
                     (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar224[0x1f] < '\0');
            auVar235 = ZEXT3264(local_340);
          }
          auVar15 = local_340;
          auVar161._0_4_ = fVar105 * (float)local_880._0_4_;
          auVar161._4_4_ = fVar237 * (float)local_880._4_4_;
          auVar161._8_4_ = fVar247 * fStack_878;
          auVar161._12_4_ = fVar249 * fStack_874;
          auVar161._16_4_ = fVar250 * fStack_870;
          auVar161._20_4_ = fVar251 * fStack_86c;
          auVar161._28_36_ = auVar235._28_36_;
          auVar161._24_4_ = fVar215 * fStack_868;
          auVar109 = vfmadd213ps_fma(local_860,_local_a20,auVar161._0_32_);
          auVar109 = vfmadd213ps_fma(_local_840,_local_7e0,ZEXT1632(auVar109));
          auVar66._4_4_ = uStack_81c;
          auVar66._0_4_ = local_820;
          auVar66._8_4_ = uStack_818;
          auVar66._12_4_ = uStack_814;
          auVar66._16_4_ = uStack_810;
          auVar66._20_4_ = uStack_80c;
          auVar66._24_4_ = uStack_808;
          auVar66._28_4_ = uStack_804;
          auVar121 = vandps_avx(ZEXT1632(auVar109),auVar66);
          auVar183._8_4_ = 0x3e99999a;
          auVar183._0_8_ = 0x3e99999a3e99999a;
          auVar183._12_4_ = 0x3e99999a;
          auVar183._16_4_ = 0x3e99999a;
          auVar183._20_4_ = 0x3e99999a;
          auVar183._24_4_ = 0x3e99999a;
          auVar183._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar183,1);
          auVar224 = vorps_avx(auVar121,local_640);
          auVar184._0_4_ = (float)local_a00._0_4_ + (float)local_6a0._0_4_;
          auVar184._4_4_ = (float)local_a00._4_4_ + (float)local_6a0._4_4_;
          auVar184._8_4_ = fStack_9f8 + fStack_698;
          auVar184._12_4_ = fStack_9f4 + fStack_694;
          auVar184._16_4_ = fStack_9f0 + fStack_690;
          auVar184._20_4_ = fStack_9ec + fStack_68c;
          auVar184._24_4_ = fStack_9e8 + fStack_688;
          auVar184._28_4_ = fStack_9e4 + fStack_684;
          auVar121 = vcmpps_avx(auVar184,auVar134,2);
          _local_880 = vandps_avx(auVar121,local_620);
          auVar185._8_4_ = 3;
          auVar185._0_8_ = 0x300000003;
          auVar185._12_4_ = 3;
          auVar185._16_4_ = 3;
          auVar185._20_4_ = 3;
          auVar185._24_4_ = 3;
          auVar185._28_4_ = 3;
          auVar200._8_4_ = 2;
          auVar200._0_8_ = 0x200000002;
          auVar200._12_4_ = 2;
          auVar200._16_4_ = 2;
          auVar200._20_4_ = 2;
          auVar200._24_4_ = 2;
          auVar200._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar200,auVar185,auVar224);
          local_860 = vpcmpgtd_avx2(auVar121,local_660);
          auVar121 = vpandn_avx2(local_860,_local_880);
          auVar224 = _local_880 & ~local_860;
          fVar236 = (float)local_a00._0_4_;
          fVar252 = (float)local_a00._4_4_;
          fVar265 = fStack_9f8;
          fVar266 = fStack_9f4;
          fVar267 = fStack_9f0;
          fVar290 = fStack_9ec;
          fVar291 = fStack_9e8;
          fVar292 = fStack_9e4;
          local_8e0 = auVar121;
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0x7f,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar224 >> 0xbf,0) != '\0') ||
              (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar224[0x1f] < '\0') {
            auVar108 = vminps_avx(auVar9,auVar11);
            auVar109 = vmaxps_avx(auVar9,auVar11);
            auVar162 = vminps_avx(auVar10,auVar8);
            auVar140 = vminps_avx(auVar108,auVar162);
            auVar108 = vmaxps_avx(auVar10,auVar8);
            auVar162 = vmaxps_avx(auVar109,auVar108);
            auVar109 = vandps_avx(auVar140,auVar238);
            auVar108 = vandps_avx(auVar162,auVar238);
            auVar109 = vmaxps_avx(auVar109,auVar108);
            auVar108 = vmovshdup_avx(auVar109);
            auVar108 = vmaxss_avx(auVar108,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar108);
            local_900._0_4_ = auVar109._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar162,auVar162,0xff);
            local_840._4_4_ = (float)local_a00._4_4_ + local_340._4_4_;
            local_840._0_4_ = (float)local_a00._0_4_ + local_340._0_4_;
            fStack_838 = fStack_9f8 + local_340._8_4_;
            fStack_834 = fStack_9f4 + local_340._12_4_;
            fStack_830 = fStack_9f0 + local_340._16_4_;
            fStack_82c = fStack_9ec + local_340._20_4_;
            fStack_828 = fStack_9e8 + local_340._24_4_;
            fStack_824 = fStack_9e4 + local_340._28_4_;
            do {
              auVar136._8_4_ = 0x7f800000;
              auVar136._0_8_ = 0x7f8000007f800000;
              auVar136._12_4_ = 0x7f800000;
              auVar136._16_4_ = 0x7f800000;
              auVar136._20_4_ = 0x7f800000;
              auVar136._24_4_ = 0x7f800000;
              auVar136._28_4_ = 0x7f800000;
              auVar224 = vblendvps_avx(auVar136,auVar15,auVar121);
              auVar13 = vshufps_avx(auVar224,auVar224,0xb1);
              auVar13 = vminps_avx(auVar224,auVar13);
              auVar16 = vshufpd_avx(auVar13,auVar13,5);
              auVar13 = vminps_avx(auVar13,auVar16);
              auVar16 = vpermpd_avx2(auVar13,0x4e);
              auVar13 = vminps_avx(auVar13,auVar16);
              auVar13 = vcmpps_avx(auVar224,auVar13,0);
              auVar16 = auVar121 & auVar13;
              auVar224 = auVar121;
              if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar16 >> 0x7f,0) != '\0') ||
                    (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar16 >> 0xbf,0) != '\0') ||
                  (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar16[0x1f] < '\0') {
                auVar224 = vandps_avx(auVar13,auVar121);
              }
              uVar94 = vmovmskps_avx(auVar224);
              iVar24 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar24 = iVar24 + 1;
              }
              uVar95 = iVar24 << 2;
              local_8e0 = auVar121;
              *(undefined4 *)(local_8e0 + uVar95) = 0;
              uVar94 = *(uint *)(local_1c0 + uVar95);
              uVar95 = *(uint *)(local_320 + uVar95);
              fVar202 = auVar6._0_4_;
              if ((float)local_9a0._0_4_ < 0.0) {
                fVar202 = sqrtf((float)local_9a0._0_4_);
              }
              local_780._0_4_ = fVar202 * 1.9073486e-06;
              auVar109 = vinsertps_avx(ZEXT416(uVar95),ZEXT416(uVar94),0x10);
              auVar271 = ZEXT1664(auVar109);
              bVar101 = true;
              uVar96 = 0;
              do {
                fVar249 = auVar271._0_4_;
                auVar115._4_4_ = fVar249;
                auVar115._0_4_ = fVar249;
                auVar115._8_4_ = fVar249;
                auVar115._12_4_ = fVar249;
                auVar162 = vfmadd213ps_fma(auVar115,local_990,_DAT_01f7aa10);
                auVar108 = vmovshdup_avx(auVar271._0_16_);
                fVar250 = auVar108._0_4_;
                fVar248 = 1.0 - fVar250;
                auVar289 = ZEXT464((uint)fVar248);
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar141 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar140 = vfmadd213ss_fma(auVar116,auVar108,auVar141);
                auVar109 = vfmadd213ss_fma(auVar140,ZEXT416((uint)(fVar250 * fVar250)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar107 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar248),auVar141);
                auVar107 = vfmadd213ss_fma(auVar107,ZEXT416((uint)(fVar248 * fVar248)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar202 = fVar248 * fVar248 * -fVar250 * 0.5;
                fVar105 = auVar109._0_4_ * 0.5;
                fVar237 = auVar107._0_4_ * 0.5;
                fVar247 = fVar250 * fVar250 * -fVar248 * 0.5;
                auVar192._0_4_ = fVar247 * fVar138;
                auVar192._4_4_ = fVar247 * fStack_adc;
                auVar192._8_4_ = fVar247 * fStack_ad8;
                auVar192._12_4_ = fVar247 * fStack_ad4;
                auVar208._4_4_ = fVar237;
                auVar208._0_4_ = fVar237;
                auVar208._8_4_ = fVar237;
                auVar208._12_4_ = fVar237;
                auVar109 = vfmadd132ps_fma(auVar208,auVar192,auVar10);
                auVar171._4_4_ = fVar105;
                auVar171._0_4_ = fVar105;
                auVar171._8_4_ = fVar105;
                auVar171._12_4_ = fVar105;
                auVar109 = vfmadd132ps_fma(auVar171,auVar109,auVar11);
                auVar193._4_4_ = fVar202;
                auVar193._0_4_ = fVar202;
                auVar193._8_4_ = fVar202;
                auVar193._12_4_ = fVar202;
                auVar109 = vfmadd132ps_fma(auVar193,auVar109,auVar9);
                auVar141 = vfmadd231ss_fma(auVar141,auVar108,ZEXT416(0x41100000));
                auVar107 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar108,
                                           ZEXT416(0x40800000));
                local_940._0_16_ = auVar109;
                auVar109 = vsubps_avx(auVar162,auVar109);
                _local_920 = auVar109;
                auVar109 = vdpps_avx(auVar109,auVar109,0x7f);
                auVar162 = vfmadd213ss_fma(auVar116,auVar108,ZEXT416(0xbf800000));
                fVar202 = auVar109._0_4_;
                if (fVar202 < 0.0) {
                  local_9c0._0_16_ = auVar141;
                  local_9e0._0_4_ = fVar248 * -2.0;
                  auVar284._0_4_ = sqrtf(fVar202);
                  auVar284._4_60_ = extraout_var_00;
                  auVar289 = ZEXT1664(ZEXT416((uint)fVar248));
                  auVar140 = ZEXT416(auVar140._0_4_);
                  auVar116 = auVar284._0_16_;
                  fVar105 = (float)local_9e0._0_4_;
                  auVar141 = local_9c0._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar109,auVar109);
                  fVar105 = fVar248 * -2.0;
                }
                fVar237 = auVar289._0_4_;
                auVar204 = vfmadd213ss_fma(auVar140,ZEXT416((uint)(fVar250 + fVar250)),
                                           ZEXT416((uint)(fVar250 * fVar250 * 3.0)));
                auVar203 = SUB6416(ZEXT464(0x40000000),0);
                auVar140 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar108,auVar203);
                auVar106 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar237 * -3.0)),
                                           ZEXT416((uint)(fVar237 + fVar237)),auVar140);
                auVar218 = auVar289._0_16_;
                auVar139 = vfnmadd231ss_fma(ZEXT416((uint)(fVar250 * (fVar237 + fVar237))),auVar218,
                                            auVar218);
                auVar140 = vfmadd213ss_fma(ZEXT416((uint)fVar105),auVar108,
                                           ZEXT416((uint)(fVar250 * fVar250)));
                fVar105 = auVar106._0_4_ * 0.5;
                fVar237 = auVar140._0_4_ * 0.5;
                auVar172._0_4_ = fVar138 * fVar237;
                auVar172._4_4_ = fStack_adc * fVar237;
                auVar172._8_4_ = fStack_ad8 * fVar237;
                auVar172._12_4_ = fStack_ad4 * fVar237;
                auVar147._4_4_ = fVar105;
                auVar147._0_4_ = fVar105;
                auVar147._8_4_ = fVar105;
                auVar147._12_4_ = fVar105;
                auVar140 = vfmadd213ps_fma(auVar147,auVar10,auVar172);
                fVar105 = auVar139._0_4_ * 0.5;
                fVar237 = auVar204._0_4_ * 0.5;
                auVar173._4_4_ = fVar237;
                auVar173._0_4_ = fVar237;
                auVar173._8_4_ = fVar237;
                auVar173._12_4_ = fVar237;
                auVar140 = vfmadd213ps_fma(auVar173,auVar11,auVar140);
                auVar275._4_4_ = fVar105;
                auVar275._0_4_ = fVar105;
                auVar275._8_4_ = fVar105;
                auVar275._12_4_ = fVar105;
                auVar204 = vfmadd213ps_fma(auVar275,auVar9,auVar140);
                auVar140 = vfmadd213ss_fma(auVar108,SUB6416(ZEXT464(0xc0400000),0),auVar203);
                local_b20 = auVar162._0_4_;
                auVar117._0_4_ = fVar138 * local_b20;
                auVar117._4_4_ = fStack_adc * local_b20;
                auVar117._8_4_ = fStack_ad8 * local_b20;
                auVar117._12_4_ = fStack_ad4 * local_b20;
                local_aa0 = auVar107._0_4_;
                auVar148._4_4_ = local_aa0;
                auVar148._0_4_ = local_aa0;
                auVar148._8_4_ = local_aa0;
                auVar148._12_4_ = local_aa0;
                auVar108 = vfmadd213ps_fma(auVar148,auVar10,auVar117);
                uVar104 = auVar141._0_4_;
                auVar174._4_4_ = uVar104;
                auVar174._0_4_ = uVar104;
                auVar174._8_4_ = uVar104;
                auVar174._12_4_ = uVar104;
                auVar108 = vfmadd213ps_fma(auVar174,auVar11,auVar108);
                auVar162 = vdpps_avx(auVar204,auVar204,0x7f);
                uVar104 = auVar140._0_4_;
                auVar149._4_4_ = uVar104;
                auVar149._0_4_ = uVar104;
                auVar149._8_4_ = uVar104;
                auVar149._12_4_ = uVar104;
                auVar107 = vfmadd213ps_fma(auVar149,auVar9,auVar108);
                auVar108 = vblendps_avx(auVar162,_DAT_01f7aa10,0xe);
                auVar140 = vrsqrtss_avx(auVar108,auVar108);
                fVar247 = auVar162._0_4_;
                fVar105 = auVar140._0_4_;
                auVar140 = vdpps_avx(auVar204,auVar107,0x7f);
                fVar105 = fVar105 * 1.5 + fVar247 * -0.5 * fVar105 * fVar105 * fVar105;
                auVar150._0_4_ = auVar107._0_4_ * fVar247;
                auVar150._4_4_ = auVar107._4_4_ * fVar247;
                auVar150._8_4_ = auVar107._8_4_ * fVar247;
                auVar150._12_4_ = auVar107._12_4_ * fVar247;
                fVar237 = auVar140._0_4_;
                auVar223._0_4_ = auVar204._0_4_ * fVar237;
                auVar223._4_4_ = auVar204._4_4_ * fVar237;
                fVar248 = auVar204._8_4_;
                auVar223._8_4_ = fVar248 * fVar237;
                fVar250 = auVar204._12_4_;
                auVar223._12_4_ = fVar250 * fVar237;
                auVar140 = vsubps_avx(auVar150,auVar223);
                auVar108 = vrcpss_avx(auVar108,auVar108);
                auVar107 = vfnmadd213ss_fma(auVar108,auVar162,auVar203);
                fVar237 = auVar108._0_4_ * auVar107._0_4_;
                auVar108 = vmaxss_avx(ZEXT416((uint)local_900._0_4_),
                                      ZEXT416((uint)(fVar249 * (float)local_780._0_4_)));
                auVar284 = ZEXT1664(auVar108);
                auVar241._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = -fVar248;
                auVar241._12_4_ = -fVar250;
                auVar194._0_4_ = fVar105 * auVar140._0_4_ * fVar237;
                auVar194._4_4_ = fVar105 * auVar140._4_4_ * fVar237;
                auVar194._8_4_ = fVar105 * auVar140._8_4_ * fVar237;
                auVar194._12_4_ = fVar105 * auVar140._12_4_ * fVar237;
                auVar256._0_4_ = auVar204._0_4_ * fVar105;
                auVar256._4_4_ = auVar204._4_4_ * fVar105;
                auVar256._8_4_ = fVar248 * fVar105;
                auVar256._12_4_ = fVar250 * fVar105;
                if (fVar247 < -fVar247) {
                  auVar289 = ZEXT1664(auVar218);
                  fVar105 = sqrtf(fVar247);
                  auVar284 = ZEXT464(auVar108._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                }
                else {
                  auVar162 = vsqrtss_avx(auVar162,auVar162);
                  fVar105 = auVar162._0_4_;
                }
                auVar264 = ZEXT1664(auVar256);
                auVar162 = vdpps_avx(_local_920,auVar256,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)local_900._0_4_),auVar116,auVar284._0_16_);
                auVar140 = vdpps_avx(auVar241,auVar256,0x7f);
                auVar107 = vdpps_avx(_local_920,auVar194,0x7f);
                auVar141 = vdpps_avx(local_990,auVar256,0x7f);
                auVar106 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_900._0_4_ / fVar105)),
                                           auVar106);
                auVar279 = ZEXT1664(auVar106);
                fVar105 = auVar140._0_4_ + auVar107._0_4_;
                fVar247 = auVar162._0_4_;
                auVar118._0_4_ = fVar247 * fVar247;
                auVar118._4_4_ = auVar162._4_4_ * auVar162._4_4_;
                auVar118._8_4_ = auVar162._8_4_ * auVar162._8_4_;
                auVar118._12_4_ = auVar162._12_4_ * auVar162._12_4_;
                auVar140 = vdpps_avx(_local_920,auVar241,0x7f);
                auVar116 = vsubps_avx(auVar109,auVar118);
                auVar107 = vrsqrtss_avx(auVar116,auVar116);
                fVar248 = auVar116._0_4_;
                fVar237 = auVar107._0_4_;
                fVar237 = fVar237 * 1.5 + fVar248 * -0.5 * fVar237 * fVar237 * fVar237;
                auVar107 = vdpps_avx(_local_920,local_990,0x7f);
                auVar140 = vfnmadd231ss_fma(auVar140,auVar162,ZEXT416((uint)fVar105));
                auVar107 = vfnmadd231ss_fma(auVar107,auVar162,auVar141);
                if (fVar248 < 0.0) {
                  local_9c0._0_16_ = auVar141;
                  local_9e0._0_4_ = fVar237;
                  local_7a0._0_16_ = auVar107;
                  auVar264 = ZEXT1664(auVar256);
                  auVar289 = ZEXT1664(auVar289._0_16_);
                  fVar248 = sqrtf(fVar248);
                  auVar279 = ZEXT464(auVar106._0_4_);
                  auVar284 = ZEXT464(auVar108._0_4_);
                  fVar237 = (float)local_9e0._0_4_;
                  auVar107 = local_7a0._0_16_;
                  auVar141 = local_9c0._0_16_;
                }
                else {
                  auVar108 = vsqrtss_avx(auVar116,auVar116);
                  fVar248 = auVar108._0_4_;
                }
                auVar246 = ZEXT1664(auVar204);
                auVar108 = vpermilps_avx(local_940._0_16_,0xff);
                fVar248 = fVar248 - auVar108._0_4_;
                auVar116 = vshufps_avx(auVar204,auVar204,0xff);
                auVar108 = vfmsub213ss_fma(auVar140,ZEXT416((uint)fVar237),auVar116);
                auVar195._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar141._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar141._12_4_ ^ 0x80000000;
                auVar209._0_8_ = auVar108._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar108._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar108._12_4_ ^ 0x80000000;
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * fVar237));
                auVar140 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * auVar108._0_4_)),
                                           ZEXT416((uint)fVar105),auVar107);
                auVar108 = vinsertps_avx(auVar209,auVar107,0x1c);
                uVar104 = auVar140._0_4_;
                auVar210._4_4_ = uVar104;
                auVar210._0_4_ = uVar104;
                auVar210._8_4_ = uVar104;
                auVar210._12_4_ = uVar104;
                auVar108 = vdivps_avx(auVar108,auVar210);
                auVar140 = vinsertps_avx(ZEXT416((uint)fVar105),auVar195,0x10);
                auVar140 = vdivps_avx(auVar140,auVar210);
                auVar175._0_4_ = fVar247 * auVar108._0_4_ + fVar248 * auVar140._0_4_;
                auVar175._4_4_ = fVar247 * auVar108._4_4_ + fVar248 * auVar140._4_4_;
                auVar175._8_4_ = fVar247 * auVar108._8_4_ + fVar248 * auVar140._8_4_;
                auVar175._12_4_ = fVar247 * auVar108._12_4_ + fVar248 * auVar140._12_4_;
                auVar140 = vsubps_avx(auVar271._0_16_,auVar175);
                auVar271 = ZEXT1664(auVar140);
                auVar108 = vandps_avx(auVar162,auVar238);
                fVar236 = (float)local_a00._0_4_;
                fVar252 = (float)local_a00._4_4_;
                fVar265 = fStack_9f8;
                fVar266 = fStack_9f4;
                fVar267 = fStack_9f0;
                fVar290 = fStack_9ec;
                fVar291 = fStack_9e8;
                fVar292 = fStack_9e4;
                if (auVar108._0_4_ < auVar279._0_4_) {
                  auVar162 = vfmadd231ss_fma(ZEXT416((uint)(auVar284._0_4_ + auVar279._0_4_)),
                                             local_7c0,ZEXT416(0x36000000));
                  auVar108 = vandps_avx(ZEXT416((uint)fVar248),auVar238);
                  if (auVar108._0_4_ < auVar162._0_4_) {
                    fVar105 = auVar140._0_4_ + (float)local_8b0._0_4_;
                    if (fVar105 < fVar103) {
                      bVar102 = 0;
                    }
                    else {
                      fVar237 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar237 < fVar105) {
                        bVar102 = 0;
                      }
                      else {
                        auVar108 = vmovshdup_avx(auVar140);
                        bVar102 = 0;
                        if ((0.0 <= auVar108._0_4_) && (auVar108._0_4_ <= 1.0)) {
                          auVar109 = vrsqrtss_avx(auVar109,auVar109);
                          fVar247 = auVar109._0_4_;
                          pGVar3 = (context->scene->geometries).items[uVar92].ptr;
                          if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar102 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar102 = 1, pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)
                                  ) {
                            fVar202 = fVar247 * 1.5 + fVar202 * -0.5 * fVar247 * fVar247 * fVar247;
                            auVar176._0_4_ = fVar202 * (float)local_920._0_4_;
                            auVar176._4_4_ = fVar202 * (float)local_920._4_4_;
                            auVar176._8_4_ = fVar202 * fStack_918;
                            auVar176._12_4_ = fVar202 * fStack_914;
                            auVar107 = vfmadd213ps_fma(auVar116,auVar176,auVar204);
                            auVar109 = vshufps_avx(auVar176,auVar176,0xc9);
                            auVar108 = vshufps_avx(auVar204,auVar204,0xc9);
                            auVar177._0_4_ = auVar176._0_4_ * auVar108._0_4_;
                            auVar177._4_4_ = auVar176._4_4_ * auVar108._4_4_;
                            auVar177._8_4_ = auVar176._8_4_ * auVar108._8_4_;
                            auVar177._12_4_ = auVar176._12_4_ * auVar108._12_4_;
                            auVar162 = vfmsub231ps_fma(auVar177,auVar204,auVar109);
                            auVar109 = vshufps_avx(auVar162,auVar162,0xc9);
                            auVar108 = vshufps_avx(auVar107,auVar107,0xc9);
                            auVar162 = vshufps_avx(auVar162,auVar162,0xd2);
                            auVar119._0_4_ = auVar107._0_4_ * auVar162._0_4_;
                            auVar119._4_4_ = auVar107._4_4_ * auVar162._4_4_;
                            auVar119._8_4_ = auVar107._8_4_ * auVar162._8_4_;
                            auVar119._12_4_ = auVar107._12_4_ * auVar162._12_4_;
                            auVar109 = vfmsub231ps_fma(auVar119,auVar109,auVar108);
                            local_710 = vshufps_avx(auVar140,auVar140,0x55);
                            local_740 = (RTCHitN  [16])vshufps_avx(auVar109,auVar109,0x55);
                            auStack_730 = vshufps_avx(auVar109,auVar109,0xaa);
                            local_720 = auVar109._0_4_;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar105;
                            local_8a0 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_a50.valid = (int *)local_8a0;
                            local_a50.geometryUserPtr = pGVar3->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_740;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            uStack_71c = local_720;
                            uStack_718 = local_720;
                            uStack_714 = local_720;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar246 = ZEXT1664(auVar204);
                              auVar264 = ZEXT1664(auVar264._0_16_);
                              auVar271 = ZEXT1664(auVar140);
                              auVar279 = ZEXT1664(auVar279._0_16_);
                              auVar284 = ZEXT1664(auVar284._0_16_);
                              auVar289 = ZEXT1664(auVar289._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_a50);
                              fVar236 = (float)local_a00._0_4_;
                              fVar252 = (float)local_a00._4_4_;
                              fVar265 = fStack_9f8;
                              fVar266 = fStack_9f4;
                              fVar267 = fStack_9f0;
                              fVar290 = fStack_9ec;
                              fVar291 = fStack_9e8;
                              fVar292 = fStack_9e4;
                            }
                            if (local_8a0 == (undefined1  [16])0x0) {
                              auVar109 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar109 = auVar109 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar246 = ZEXT1664(auVar246._0_16_);
                                auVar264 = ZEXT1664(auVar264._0_16_);
                                auVar271 = ZEXT1664(auVar271._0_16_);
                                auVar279 = ZEXT1664(auVar279._0_16_);
                                auVar284 = ZEXT1664(auVar284._0_16_);
                                auVar289 = ZEXT1664(auVar289._0_16_);
                                (*p_Var4)(&local_a50);
                                fVar236 = (float)local_a00._0_4_;
                                fVar252 = (float)local_a00._4_4_;
                                fVar265 = fStack_9f8;
                                fVar266 = fStack_9f4;
                                fVar267 = fStack_9f0;
                                fVar290 = fStack_9ec;
                                fVar291 = fStack_9e8;
                                fVar292 = fStack_9e4;
                              }
                              auVar108 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                              auVar109 = auVar108 ^ _DAT_01f7ae20;
                              auVar178._8_4_ = 0xff800000;
                              auVar178._0_8_ = 0xff800000ff800000;
                              auVar178._12_4_ = 0xff800000;
                              auVar108 = vblendvps_avx(auVar178,*(undefined1 (*) [16])
                                                                 (local_a50.ray + 0x80),auVar108);
                              *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar108;
                            }
                            auVar151._8_8_ = 0x100000001;
                            auVar151._0_8_ = 0x100000001;
                            bVar102 = (auVar151 & auVar109) != (undefined1  [16])0x0;
                            if (!(bool)bVar102) {
                              *(float *)(ray + k * 4 + 0x80) = fVar237;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_0160ce18;
                  }
                }
                bVar101 = uVar96 < 4;
                uVar96 = uVar96 + 1;
              } while (uVar96 != 5);
              bVar101 = false;
              bVar102 = 5;
LAB_0160ce18:
              bVar100 = (bool)(bVar100 | bVar101 & bVar102);
              uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar134._4_4_ = uVar104;
              auVar134._0_4_ = uVar104;
              auVar134._8_4_ = uVar104;
              auVar134._12_4_ = uVar104;
              auVar134._16_4_ = uVar104;
              auVar134._20_4_ = uVar104;
              auVar134._24_4_ = uVar104;
              auVar134._28_4_ = uVar104;
              auVar224 = vcmpps_avx(_local_840,auVar134,2);
              auVar121 = vandps_avx(auVar224,local_8e0);
              auVar224 = local_8e0 & auVar224;
              local_8e0 = auVar121;
            } while ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar224 >> 0x7f,0) != '\0') ||
                       (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar224 >> 0xbf,0) != '\0') ||
                     (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar224[0x1f] < '\0');
          }
          auVar186._0_4_ = fVar236 + local_380._0_4_;
          auVar186._4_4_ = fVar252 + local_380._4_4_;
          auVar186._8_4_ = fVar265 + local_380._8_4_;
          auVar186._12_4_ = fVar266 + local_380._12_4_;
          auVar186._16_4_ = fVar267 + local_380._16_4_;
          auVar186._20_4_ = fVar290 + local_380._20_4_;
          auVar186._24_4_ = fVar291 + local_380._24_4_;
          auVar186._28_4_ = fVar292 + local_380._28_4_;
          auVar224 = vcmpps_avx(auVar186,auVar134,2);
          auVar121 = vandps_avx(local_600,local_5e0);
          auVar121 = vandps_avx(auVar224,auVar121);
          auVar201._0_4_ = fVar236 + local_340._0_4_;
          auVar201._4_4_ = fVar252 + local_340._4_4_;
          auVar201._8_4_ = fVar265 + local_340._8_4_;
          auVar201._12_4_ = fVar266 + local_340._12_4_;
          auVar201._16_4_ = fVar267 + local_340._16_4_;
          auVar201._20_4_ = fVar290 + local_340._20_4_;
          auVar201._24_4_ = fVar291 + local_340._24_4_;
          auVar201._28_4_ = fVar292 + local_340._28_4_;
          auVar15 = vcmpps_avx(auVar201,auVar134,2);
          auVar224 = vandps_avx(_local_880,local_860);
          auVar224 = vandps_avx(auVar15,auVar224);
          auVar224 = vorps_avx(auVar121,auVar224);
          if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar224 >> 0x7f,0) != '\0') ||
                (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar224 >> 0xbf,0) != '\0') ||
              (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar224[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar98 * 0x60) = auVar224;
            auVar121 = vblendvps_avx(local_340,local_380,auVar121);
            *(undefined1 (*) [32])(auStack_160 + uVar98 * 0x60) = auVar121;
            uVar1 = vmovlps_avx(local_570);
            (&uStack_140)[uVar98 * 0xc] = uVar1;
            aiStack_138[uVar98 * 0x18] = local_c08 + 1;
            iVar97 = iVar97 + 1;
          }
        }
      }
    }
    if (iVar97 == 0) break;
    uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar131._4_4_ = uVar104;
    auVar131._0_4_ = uVar104;
    auVar131._8_4_ = uVar104;
    auVar131._12_4_ = uVar104;
    auVar131._16_4_ = uVar104;
    auVar131._20_4_ = uVar104;
    auVar131._24_4_ = uVar104;
    auVar131._28_4_ = uVar104;
    uVar94 = -iVar97;
    pauVar93 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar97 - 1) * 0x60);
    while( true ) {
      auVar121 = pauVar93[1];
      auVar156._0_4_ = fVar236 + auVar121._0_4_;
      auVar156._4_4_ = fVar252 + auVar121._4_4_;
      auVar156._8_4_ = fVar265 + auVar121._8_4_;
      auVar156._12_4_ = fVar266 + auVar121._12_4_;
      auVar156._16_4_ = fVar267 + auVar121._16_4_;
      auVar156._20_4_ = fVar290 + auVar121._20_4_;
      auVar156._24_4_ = fVar291 + auVar121._24_4_;
      auVar156._28_4_ = fVar292 + auVar121._28_4_;
      auVar224 = vcmpps_avx(auVar156,auVar131,2);
      _local_740 = vandps_avx(auVar224,*pauVar93);
      auVar224 = *pauVar93 & auVar224;
      if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar224 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar224 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar224 >> 0x7f,0) != '\0') ||
            (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar224 >> 0xbf,0) != '\0') ||
          (auVar224 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar224[0x1f] < '\0') break;
      pauVar93 = pauVar93 + -3;
      uVar94 = uVar94 + 1;
      if (uVar94 == 0) goto LAB_0160d2f7;
    }
    auVar132._8_4_ = 0x7f800000;
    auVar132._0_8_ = 0x7f8000007f800000;
    auVar132._12_4_ = 0x7f800000;
    auVar132._16_4_ = 0x7f800000;
    auVar132._20_4_ = 0x7f800000;
    auVar132._24_4_ = 0x7f800000;
    auVar132._28_4_ = 0x7f800000;
    auVar121 = vblendvps_avx(auVar132,auVar121,_local_740);
    auVar224 = vshufps_avx(auVar121,auVar121,0xb1);
    auVar224 = vminps_avx(auVar121,auVar224);
    auVar15 = vshufpd_avx(auVar224,auVar224,5);
    auVar224 = vminps_avx(auVar224,auVar15);
    auVar15 = vpermpd_avx2(auVar224,0x4e);
    auVar224 = vminps_avx(auVar224,auVar15);
    auVar224 = vcmpps_avx(auVar121,auVar224,0);
    auVar15 = _local_740 & auVar224;
    auVar121 = _local_740;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar121 = vandps_avx(auVar224,_local_740);
    }
    uVar96 = *(ulong *)pauVar93[2];
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar96;
    uVar95 = vmovmskps_avx(auVar121);
    iVar97 = 0;
    for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x80000000) {
      iVar97 = iVar97 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar97 << 2)) = 0;
    uVar95 = ~uVar94;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar95 = -uVar94;
    }
    uVar98 = (ulong)uVar95;
    local_c08 = *(int *)(pauVar93[2] + 8);
    *pauVar93 = _local_740;
    uVar104 = (undefined4)uVar96;
    auVar157._4_4_ = uVar104;
    auVar157._0_4_ = uVar104;
    auVar157._8_4_ = uVar104;
    auVar157._12_4_ = uVar104;
    auVar157._16_4_ = uVar104;
    auVar157._20_4_ = uVar104;
    auVar157._24_4_ = uVar104;
    auVar157._28_4_ = uVar104;
    auVar109 = vmovshdup_avx(auVar110);
    auVar109 = vsubps_avx(auVar109,auVar110);
    auVar133._0_4_ = auVar109._0_4_;
    auVar133._4_4_ = auVar133._0_4_;
    auVar133._8_4_ = auVar133._0_4_;
    auVar133._12_4_ = auVar133._0_4_;
    auVar133._16_4_ = auVar133._0_4_;
    auVar133._20_4_ = auVar133._0_4_;
    auVar133._24_4_ = auVar133._0_4_;
    auVar133._28_4_ = auVar133._0_4_;
    auVar109 = vfmadd132ps_fma(auVar133,auVar157,_DAT_01faff20);
    local_380 = ZEXT1632(auVar109);
    auVar235 = ZEXT864(*(ulong *)(local_380 + (uint)(iVar97 << 2)));
  } while( true );
LAB_0160d2f7:
  if (bVar100 != false) {
    return bVar100;
  }
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar120._4_4_ = uVar104;
  auVar120._0_4_ = uVar104;
  auVar120._8_4_ = uVar104;
  auVar120._12_4_ = uVar104;
  auVar5 = vcmpps_avx(local_580,auVar120,2);
  uVar92 = vmovmskps_avx(auVar5);
  uVar92 = (uint)local_888 & uVar92;
  if (uVar92 == 0) {
    return false;
  }
  goto LAB_0160a9bf;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }